

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

bool embree::avx512::CurveNvIntersectorK<8,8>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::BSplineCurveT,8,8>,embree::avx512::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Primitive PVar10;
  int iVar11;
  Geometry *pGVar12;
  RTCFilterFunctionN p_Var13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  undefined8 uVar23;
  long lVar24;
  long lVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  long lVar67;
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  byte bVar70;
  ulong uVar71;
  ulong uVar72;
  uint uVar73;
  ulong uVar74;
  ulong uVar75;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  long lVar76;
  byte bVar77;
  float fVar78;
  float fVar79;
  float fVar125;
  float fVar126;
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar85 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar86 [16];
  float fVar127;
  float fVar129;
  float fVar130;
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  float fVar128;
  float fVar131;
  float fVar132;
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float fVar133;
  undefined4 uVar134;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar140;
  float fVar141;
  undefined1 auVar139 [32];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined8 uVar142;
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  float fVar149;
  float fVar150;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  float fVar167;
  float fVar169;
  undefined1 auVar168 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [16];
  undefined1 auVar173 [32];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  RTCFilterFunctionNArguments args;
  float old_t;
  float old_t_1;
  RTCFilterFunctionNArguments local_6b0;
  undefined1 local_680 [32];
  undefined1 local_660 [16];
  undefined1 local_650 [16];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_490 [8];
  float fStack_488;
  float fStack_484;
  undefined8 local_480;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  uint local_420;
  undefined4 uStack_41c;
  undefined4 uStack_418;
  undefined4 uStack_414;
  undefined4 uStack_410;
  undefined4 uStack_40c;
  undefined4 uStack_408;
  undefined4 uStack_404;
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined4 local_380;
  int local_37c;
  undefined1 local_370 [16];
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  float local_320 [4];
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined4 local_280;
  undefined4 uStack_27c;
  undefined4 uStack_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined4 uStack_268;
  undefined4 uStack_264;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined4 local_200;
  undefined4 uStack_1fc;
  undefined4 uStack_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  uint local_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined4 uStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar181 [64];
  undefined1 auVar182 [64];
  
  PVar10 = prim[1];
  uVar71 = (ulong)(byte)PVar10;
  lVar67 = uVar71 * 0x19;
  fVar150 = *(float *)(prim + lVar67 + 0x12);
  auVar22 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar22 = vinsertps_avx(auVar22,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar82 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar83 = vinsertps_avx(auVar82,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar85 = vsubps_avx(auVar22,*(undefined1 (*) [16])(prim + lVar67 + 6));
  fVar149 = fVar150 * auVar85._0_4_;
  fVar133 = fVar150 * auVar83._0_4_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar71 * 4 + 6);
  auVar93 = vpmovsxbd_avx2(auVar22);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar71 * 5 + 6);
  auVar90 = vpmovsxbd_avx2(auVar82);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar71 * 6 + 6);
  auVar91 = vpmovsxbd_avx2(auVar84);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar71 * 0xb + 6);
  auVar92 = vpmovsxbd_avx2(auVar81);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar10 * 0xc) + 6);
  auVar97 = vpmovsxbd_avx2(auVar80);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar95 = vcvtdq2ps_avx(auVar97);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + (uint)(byte)PVar10 * 0xc + uVar71 + 6);
  auVar94 = vpmovsxbd_avx2(auVar6);
  auVar94 = vcvtdq2ps_avx(auVar94);
  uVar74 = (ulong)(uint)((int)(uVar71 * 9) * 2);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar74 + 6);
  auVar103 = vpmovsxbd_avx2(auVar7);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar74 + uVar71 + 6);
  auVar102 = vpmovsxbd_avx2(auVar8);
  auVar102 = vcvtdq2ps_avx(auVar102);
  uVar72 = (ulong)(uint)((int)(uVar71 * 5) << 2);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar72 + 6);
  auVar89 = vpmovsxbd_avx2(auVar9);
  auVar96 = vcvtdq2ps_avx(auVar89);
  auVar177._4_4_ = fVar133;
  auVar177._0_4_ = fVar133;
  auVar177._8_4_ = fVar133;
  auVar177._12_4_ = fVar133;
  auVar177._16_4_ = fVar133;
  auVar177._20_4_ = fVar133;
  auVar177._24_4_ = fVar133;
  auVar177._28_4_ = fVar133;
  auVar183._8_4_ = 1;
  auVar183._0_8_ = 0x100000001;
  auVar183._12_4_ = 1;
  auVar183._16_4_ = 1;
  auVar183._20_4_ = 1;
  auVar183._24_4_ = 1;
  auVar183._28_4_ = 1;
  auVar87 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar99 = ZEXT1632(CONCAT412(fVar150 * auVar83._12_4_,
                               CONCAT48(fVar150 * auVar83._8_4_,
                                        CONCAT44(fVar150 * auVar83._4_4_,fVar133))));
  auVar98 = vpermps_avx2(auVar183,auVar99);
  auVar88 = vpermps_avx512vl(auVar87,auVar99);
  fVar133 = auVar88._0_4_;
  fVar140 = auVar88._4_4_;
  auVar99._4_4_ = fVar140 * auVar91._4_4_;
  auVar99._0_4_ = fVar133 * auVar91._0_4_;
  fVar141 = auVar88._8_4_;
  auVar99._8_4_ = fVar141 * auVar91._8_4_;
  fVar167 = auVar88._12_4_;
  auVar99._12_4_ = fVar167 * auVar91._12_4_;
  fVar169 = auVar88._16_4_;
  auVar99._16_4_ = fVar169 * auVar91._16_4_;
  fVar78 = auVar88._20_4_;
  auVar99._20_4_ = fVar78 * auVar91._20_4_;
  fVar79 = auVar88._24_4_;
  auVar99._24_4_ = fVar79 * auVar91._24_4_;
  auVar99._28_4_ = auVar97._28_4_;
  auVar97._4_4_ = auVar94._4_4_ * fVar140;
  auVar97._0_4_ = auVar94._0_4_ * fVar133;
  auVar97._8_4_ = auVar94._8_4_ * fVar141;
  auVar97._12_4_ = auVar94._12_4_ * fVar167;
  auVar97._16_4_ = auVar94._16_4_ * fVar169;
  auVar97._20_4_ = auVar94._20_4_ * fVar78;
  auVar97._24_4_ = auVar94._24_4_ * fVar79;
  auVar97._28_4_ = auVar89._28_4_;
  auVar89._4_4_ = auVar96._4_4_ * fVar140;
  auVar89._0_4_ = auVar96._0_4_ * fVar133;
  auVar89._8_4_ = auVar96._8_4_ * fVar141;
  auVar89._12_4_ = auVar96._12_4_ * fVar167;
  auVar89._16_4_ = auVar96._16_4_ * fVar169;
  auVar89._20_4_ = auVar96._20_4_ * fVar78;
  auVar89._24_4_ = auVar96._24_4_ * fVar79;
  auVar89._28_4_ = auVar88._28_4_;
  auVar22 = vfmadd231ps_fma(auVar99,auVar98,auVar90);
  auVar82 = vfmadd231ps_fma(auVar97,auVar98,auVar95);
  auVar84 = vfmadd231ps_fma(auVar89,auVar102,auVar98);
  auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar177,auVar93);
  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar177,auVar92);
  auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar103,auVar177);
  auVar178._4_4_ = fVar149;
  auVar178._0_4_ = fVar149;
  auVar178._8_4_ = fVar149;
  auVar178._12_4_ = fVar149;
  auVar178._16_4_ = fVar149;
  auVar178._20_4_ = fVar149;
  auVar178._24_4_ = fVar149;
  auVar178._28_4_ = fVar149;
  auVar89 = ZEXT1632(CONCAT412(fVar150 * auVar85._12_4_,
                               CONCAT48(fVar150 * auVar85._8_4_,
                                        CONCAT44(fVar150 * auVar85._4_4_,fVar149))));
  auVar97 = vpermps_avx2(auVar183,auVar89);
  auVar89 = vpermps_avx512vl(auVar87,auVar89);
  fVar150 = auVar89._0_4_;
  fVar133 = auVar89._4_4_;
  auVar98._4_4_ = fVar133 * auVar91._4_4_;
  auVar98._0_4_ = fVar150 * auVar91._0_4_;
  fVar140 = auVar89._8_4_;
  auVar98._8_4_ = fVar140 * auVar91._8_4_;
  fVar141 = auVar89._12_4_;
  auVar98._12_4_ = fVar141 * auVar91._12_4_;
  fVar167 = auVar89._16_4_;
  auVar98._16_4_ = fVar167 * auVar91._16_4_;
  fVar169 = auVar89._20_4_;
  auVar98._20_4_ = fVar169 * auVar91._20_4_;
  fVar78 = auVar89._24_4_;
  auVar98._24_4_ = fVar78 * auVar91._24_4_;
  auVar98._28_4_ = 1;
  auVar87._4_4_ = auVar94._4_4_ * fVar133;
  auVar87._0_4_ = auVar94._0_4_ * fVar150;
  auVar87._8_4_ = auVar94._8_4_ * fVar140;
  auVar87._12_4_ = auVar94._12_4_ * fVar141;
  auVar87._16_4_ = auVar94._16_4_ * fVar167;
  auVar87._20_4_ = auVar94._20_4_ * fVar169;
  auVar87._24_4_ = auVar94._24_4_ * fVar78;
  auVar87._28_4_ = auVar91._28_4_;
  auVar94._4_4_ = auVar96._4_4_ * fVar133;
  auVar94._0_4_ = auVar96._0_4_ * fVar150;
  auVar94._8_4_ = auVar96._8_4_ * fVar140;
  auVar94._12_4_ = auVar96._12_4_ * fVar141;
  auVar94._16_4_ = auVar96._16_4_ * fVar167;
  auVar94._20_4_ = auVar96._20_4_ * fVar169;
  auVar94._24_4_ = auVar96._24_4_ * fVar78;
  auVar94._28_4_ = auVar89._28_4_;
  auVar81 = vfmadd231ps_fma(auVar98,auVar97,auVar90);
  auVar80 = vfmadd231ps_fma(auVar87,auVar97,auVar95);
  auVar6 = vfmadd231ps_fma(auVar94,auVar97,auVar102);
  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar178,auVar93);
  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar178,auVar92);
  auVar170._8_4_ = 0x7fffffff;
  auVar170._0_8_ = 0x7fffffff7fffffff;
  auVar170._12_4_ = 0x7fffffff;
  auVar170._16_4_ = 0x7fffffff;
  auVar170._20_4_ = 0x7fffffff;
  auVar170._24_4_ = 0x7fffffff;
  auVar170._28_4_ = 0x7fffffff;
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar178,auVar103);
  auVar93 = vandps_avx(ZEXT1632(auVar22),auVar170);
  auVar168._8_4_ = 0x219392ef;
  auVar168._0_8_ = 0x219392ef219392ef;
  auVar168._12_4_ = 0x219392ef;
  auVar168._16_4_ = 0x219392ef;
  auVar168._20_4_ = 0x219392ef;
  auVar168._24_4_ = 0x219392ef;
  auVar168._28_4_ = 0x219392ef;
  uVar74 = vcmpps_avx512vl(auVar93,auVar168,1);
  bVar14 = (bool)((byte)uVar74 & 1);
  auVar88._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar22._0_4_;
  bVar14 = (bool)((byte)(uVar74 >> 1) & 1);
  auVar88._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar22._4_4_;
  bVar14 = (bool)((byte)(uVar74 >> 2) & 1);
  auVar88._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar22._8_4_;
  bVar14 = (bool)((byte)(uVar74 >> 3) & 1);
  auVar88._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar22._12_4_;
  auVar88._16_4_ = (uint)((byte)(uVar74 >> 4) & 1) * 0x219392ef;
  auVar88._20_4_ = (uint)((byte)(uVar74 >> 5) & 1) * 0x219392ef;
  auVar88._24_4_ = (uint)((byte)(uVar74 >> 6) & 1) * 0x219392ef;
  auVar88._28_4_ = (uint)(byte)(uVar74 >> 7) * 0x219392ef;
  auVar93 = vandps_avx(ZEXT1632(auVar82),auVar170);
  uVar74 = vcmpps_avx512vl(auVar93,auVar168,1);
  bVar14 = (bool)((byte)uVar74 & 1);
  auVar100._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar82._0_4_;
  bVar14 = (bool)((byte)(uVar74 >> 1) & 1);
  auVar100._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar82._4_4_;
  bVar14 = (bool)((byte)(uVar74 >> 2) & 1);
  auVar100._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar82._8_4_;
  bVar14 = (bool)((byte)(uVar74 >> 3) & 1);
  auVar100._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar82._12_4_;
  auVar100._16_4_ = (uint)((byte)(uVar74 >> 4) & 1) * 0x219392ef;
  auVar100._20_4_ = (uint)((byte)(uVar74 >> 5) & 1) * 0x219392ef;
  auVar100._24_4_ = (uint)((byte)(uVar74 >> 6) & 1) * 0x219392ef;
  auVar100._28_4_ = (uint)(byte)(uVar74 >> 7) * 0x219392ef;
  auVar93 = vandps_avx(ZEXT1632(auVar84),auVar170);
  uVar74 = vcmpps_avx512vl(auVar93,auVar168,1);
  bVar14 = (bool)((byte)uVar74 & 1);
  auVar93._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar84._0_4_;
  bVar14 = (bool)((byte)(uVar74 >> 1) & 1);
  auVar93._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar84._4_4_;
  bVar14 = (bool)((byte)(uVar74 >> 2) & 1);
  auVar93._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar84._8_4_;
  bVar14 = (bool)((byte)(uVar74 >> 3) & 1);
  auVar93._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar84._12_4_;
  auVar93._16_4_ = (uint)((byte)(uVar74 >> 4) & 1) * 0x219392ef;
  auVar93._20_4_ = (uint)((byte)(uVar74 >> 5) & 1) * 0x219392ef;
  auVar93._24_4_ = (uint)((byte)(uVar74 >> 6) & 1) * 0x219392ef;
  auVar93._28_4_ = (uint)(byte)(uVar74 >> 7) * 0x219392ef;
  auVar90 = vrcp14ps_avx512vl(auVar88);
  auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar92 = vfnmadd213ps_avx512vl(auVar88,auVar90,auVar91);
  auVar22 = vfmadd132ps_fma(auVar92,auVar90,auVar90);
  auVar90 = vrcp14ps_avx512vl(auVar100);
  auVar92 = vfnmadd213ps_avx512vl(auVar100,auVar90,auVar91);
  auVar82 = vfmadd132ps_fma(auVar92,auVar90,auVar90);
  auVar90 = vrcp14ps_avx512vl(auVar93);
  auVar93 = vfnmadd213ps_avx512vl(auVar93,auVar90,auVar91);
  auVar84 = vfmadd132ps_fma(auVar93,auVar90,auVar90);
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar71 * 7 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar81));
  auVar103._4_4_ = auVar22._4_4_ * auVar93._4_4_;
  auVar103._0_4_ = auVar22._0_4_ * auVar93._0_4_;
  auVar103._8_4_ = auVar22._8_4_ * auVar93._8_4_;
  auVar103._12_4_ = auVar22._12_4_ * auVar93._12_4_;
  auVar103._16_4_ = auVar93._16_4_ * 0.0;
  auVar103._20_4_ = auVar93._20_4_ * 0.0;
  auVar103._24_4_ = auVar93._24_4_ * 0.0;
  auVar103._28_4_ = auVar93._28_4_;
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar71 * 9 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar81));
  auVar94 = vpbroadcastd_avx512vl();
  auVar90 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar10 * 0x10 + 6));
  auVar147._0_4_ = auVar22._0_4_ * auVar93._0_4_;
  auVar147._4_4_ = auVar22._4_4_ * auVar93._4_4_;
  auVar147._8_4_ = auVar22._8_4_ * auVar93._8_4_;
  auVar147._12_4_ = auVar22._12_4_ * auVar93._12_4_;
  auVar147._16_4_ = auVar93._16_4_ * 0.0;
  auVar147._20_4_ = auVar93._20_4_ * 0.0;
  auVar147._24_4_ = auVar93._24_4_ * 0.0;
  auVar147._28_4_ = 0;
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar10 * 0x10 + uVar71 * -2 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar80));
  auVar102._4_4_ = auVar82._4_4_ * auVar93._4_4_;
  auVar102._0_4_ = auVar82._0_4_ * auVar93._0_4_;
  auVar102._8_4_ = auVar82._8_4_ * auVar93._8_4_;
  auVar102._12_4_ = auVar82._12_4_ * auVar93._12_4_;
  auVar102._16_4_ = auVar93._16_4_ * 0.0;
  auVar102._20_4_ = auVar93._20_4_ * 0.0;
  auVar102._24_4_ = auVar93._24_4_ * 0.0;
  auVar102._28_4_ = auVar93._28_4_;
  auVar93 = vcvtdq2ps_avx(auVar90);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar80));
  auVar145._0_4_ = auVar82._0_4_ * auVar93._0_4_;
  auVar145._4_4_ = auVar82._4_4_ * auVar93._4_4_;
  auVar145._8_4_ = auVar82._8_4_ * auVar93._8_4_;
  auVar145._12_4_ = auVar82._12_4_ * auVar93._12_4_;
  auVar145._16_4_ = auVar93._16_4_ * 0.0;
  auVar145._20_4_ = auVar93._20_4_ * 0.0;
  auVar145._24_4_ = auVar93._24_4_ * 0.0;
  auVar145._28_4_ = 0;
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 + uVar71 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar6));
  auVar96._4_4_ = auVar93._4_4_ * auVar84._4_4_;
  auVar96._0_4_ = auVar93._0_4_ * auVar84._0_4_;
  auVar96._8_4_ = auVar93._8_4_ * auVar84._8_4_;
  auVar96._12_4_ = auVar93._12_4_ * auVar84._12_4_;
  auVar96._16_4_ = auVar93._16_4_ * 0.0;
  auVar96._20_4_ = auVar93._20_4_ * 0.0;
  auVar96._24_4_ = auVar93._24_4_ * 0.0;
  auVar96._28_4_ = auVar93._28_4_;
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar71 * 0x17 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar6));
  auVar101._0_4_ = auVar84._0_4_ * auVar93._0_4_;
  auVar101._4_4_ = auVar84._4_4_ * auVar93._4_4_;
  auVar101._8_4_ = auVar84._8_4_ * auVar93._8_4_;
  auVar101._12_4_ = auVar84._12_4_ * auVar93._12_4_;
  auVar101._16_4_ = auVar93._16_4_ * 0.0;
  auVar101._20_4_ = auVar93._20_4_ * 0.0;
  auVar101._24_4_ = auVar93._24_4_ * 0.0;
  auVar101._28_4_ = 0;
  auVar93 = vpminsd_avx2(auVar103,auVar147);
  auVar90 = vpminsd_avx2(auVar102,auVar145);
  auVar93 = vmaxps_avx(auVar93,auVar90);
  auVar90 = vpminsd_avx2(auVar96,auVar101);
  uVar134 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar91._4_4_ = uVar134;
  auVar91._0_4_ = uVar134;
  auVar91._8_4_ = uVar134;
  auVar91._12_4_ = uVar134;
  auVar91._16_4_ = uVar134;
  auVar91._20_4_ = uVar134;
  auVar91._24_4_ = uVar134;
  auVar91._28_4_ = uVar134;
  auVar90 = vmaxps_avx512vl(auVar90,auVar91);
  auVar93 = vmaxps_avx(auVar93,auVar90);
  auVar90._8_4_ = 0x3f7ffffa;
  auVar90._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar90._12_4_ = 0x3f7ffffa;
  auVar90._16_4_ = 0x3f7ffffa;
  auVar90._20_4_ = 0x3f7ffffa;
  auVar90._24_4_ = 0x3f7ffffa;
  auVar90._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar93,auVar90);
  auVar93 = vpmaxsd_avx2(auVar103,auVar147);
  auVar90 = vpmaxsd_avx2(auVar102,auVar145);
  auVar93 = vminps_avx(auVar93,auVar90);
  auVar90 = vpmaxsd_avx2(auVar96,auVar101);
  uVar134 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar92._4_4_ = uVar134;
  auVar92._0_4_ = uVar134;
  auVar92._8_4_ = uVar134;
  auVar92._12_4_ = uVar134;
  auVar92._16_4_ = uVar134;
  auVar92._20_4_ = uVar134;
  auVar92._24_4_ = uVar134;
  auVar92._28_4_ = uVar134;
  auVar90 = vminps_avx512vl(auVar90,auVar92);
  auVar93 = vminps_avx(auVar93,auVar90);
  auVar95._8_4_ = 0x3f800003;
  auVar95._0_8_ = 0x3f8000033f800003;
  auVar95._12_4_ = 0x3f800003;
  auVar95._16_4_ = 0x3f800003;
  auVar95._20_4_ = 0x3f800003;
  auVar95._24_4_ = 0x3f800003;
  auVar95._28_4_ = 0x3f800003;
  auVar93 = vmulps_avx512vl(auVar93,auVar95);
  uVar23 = vpcmpgtd_avx512vl(auVar94,_DAT_01fe9900);
  uVar142 = vcmpps_avx512vl(local_80,auVar93,2);
  if ((byte)((byte)uVar142 & (byte)uVar23) == 0) {
    bVar77 = 0;
  }
  else {
    uVar74 = (ulong)(byte)((byte)uVar142 & (byte)uVar23);
    local_2a0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    do {
      lVar24 = 0;
      for (uVar71 = uVar74; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x8000000000000000) {
        lVar24 = lVar24 + 1;
      }
      uVar74 = uVar74 - 1 & uVar74;
      local_440._0_4_ = *(undefined4 *)(prim + lVar24 * 4 + 6);
      uVar71 = (ulong)(uint)((int)lVar24 << 6);
      uVar73 = *(uint *)(prim + 2);
      pGVar12 = (context->scene->geometries).items[uVar73].ptr;
      auVar22 = *(undefined1 (*) [16])(prim + uVar71 + lVar67 + 0x16);
      if (uVar74 != 0) {
        uVar75 = uVar74 - 1 & uVar74;
        for (uVar72 = uVar74; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x8000000000000000) {
        }
        if (uVar75 != 0) {
          for (; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x8000000000000000) {
          }
        }
      }
      local_650 = *(undefined1 (*) [16])(prim + uVar71 + lVar67 + 0x26);
      local_660 = *(undefined1 (*) [16])(prim + uVar71 + lVar67 + 0x36);
      _local_490 = *(undefined1 (*) [16])(prim + uVar71 + lVar67 + 0x46);
      local_5a0._0_8_ = pGVar12;
      iVar11 = (int)pGVar12[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar82 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20))
                              ,0x1c);
      auVar82 = vinsertps_avx(auVar82,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar81 = vsubps_avx(auVar22,auVar82);
      uVar134 = auVar81._0_4_;
      auVar83._4_4_ = uVar134;
      auVar83._0_4_ = uVar134;
      auVar83._8_4_ = uVar134;
      auVar83._12_4_ = uVar134;
      auVar84 = vshufps_avx(auVar81,auVar81,0x55);
      auVar81 = vshufps_avx(auVar81,auVar81,0xaa);
      aVar4 = pre->ray_space[k].vx.field_0;
      aVar5 = pre->ray_space[k].vy.field_0;
      fVar150 = pre->ray_space[k].vz.field_0.m128[0];
      fVar133 = pre->ray_space[k].vz.field_0.m128[1];
      fVar140 = pre->ray_space[k].vz.field_0.m128[2];
      fVar141 = pre->ray_space[k].vz.field_0.m128[3];
      auVar86._0_4_ = fVar150 * auVar81._0_4_;
      auVar86._4_4_ = fVar133 * auVar81._4_4_;
      auVar86._8_4_ = fVar140 * auVar81._8_4_;
      auVar86._12_4_ = fVar141 * auVar81._12_4_;
      auVar84 = vfmadd231ps_fma(auVar86,(undefined1  [16])aVar5,auVar84);
      auVar6 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar4,auVar83);
      auVar84 = vshufps_avx(auVar22,auVar22,0xff);
      auVar80 = vsubps_avx(local_650,auVar82);
      uVar134 = auVar80._0_4_;
      auVar151._4_4_ = uVar134;
      auVar151._0_4_ = uVar134;
      auVar151._8_4_ = uVar134;
      auVar151._12_4_ = uVar134;
      auVar81 = vshufps_avx(auVar80,auVar80,0x55);
      auVar80 = vshufps_avx(auVar80,auVar80,0xaa);
      auVar172._0_4_ = fVar150 * auVar80._0_4_;
      auVar172._4_4_ = fVar133 * auVar80._4_4_;
      auVar172._8_4_ = fVar140 * auVar80._8_4_;
      auVar172._12_4_ = fVar141 * auVar80._12_4_;
      auVar81 = vfmadd231ps_fma(auVar172,(undefined1  [16])aVar5,auVar81);
      auVar7 = vfmadd231ps_fma(auVar81,(undefined1  [16])aVar4,auVar151);
      auVar80 = vsubps_avx512vl(local_660,auVar82);
      uVar134 = auVar80._0_4_;
      auVar152._4_4_ = uVar134;
      auVar152._0_4_ = uVar134;
      auVar152._8_4_ = uVar134;
      auVar152._12_4_ = uVar134;
      auVar81 = vshufps_avx(auVar80,auVar80,0x55);
      auVar80 = vshufps_avx(auVar80,auVar80,0xaa);
      auVar174._0_4_ = fVar150 * auVar80._0_4_;
      auVar174._4_4_ = fVar133 * auVar80._4_4_;
      auVar174._8_4_ = fVar140 * auVar80._8_4_;
      auVar174._12_4_ = fVar141 * auVar80._12_4_;
      auVar81 = vfmadd231ps_fma(auVar174,(undefined1  [16])aVar5,auVar81);
      auVar80 = vfmadd231ps_fma(auVar81,(undefined1  [16])aVar4,auVar152);
      auVar81 = vsubps_avx512vl(_local_490,auVar82);
      uVar134 = auVar81._0_4_;
      auVar85._4_4_ = uVar134;
      auVar85._0_4_ = uVar134;
      auVar85._8_4_ = uVar134;
      auVar85._12_4_ = uVar134;
      auVar82 = vshufps_avx(auVar81,auVar81,0x55);
      auVar81 = vshufps_avx(auVar81,auVar81,0xaa);
      auVar175._0_4_ = fVar150 * auVar81._0_4_;
      auVar175._4_4_ = fVar133 * auVar81._4_4_;
      auVar175._8_4_ = fVar140 * auVar81._8_4_;
      auVar175._12_4_ = fVar141 * auVar81._12_4_;
      auVar82 = vfmadd231ps_fma(auVar175,(undefined1  [16])aVar5,auVar82);
      auVar81 = vfmadd231ps_fma(auVar82,(undefined1  [16])aVar4,auVar85);
      lVar24 = (long)iVar11 * 0x44;
      auVar93 = *(undefined1 (*) [32])(bspline_basis0 + lVar24);
      local_500 = vbroadcastss_avx512vl(auVar6);
      auVar139._8_4_ = 1;
      auVar139._0_8_ = 0x100000001;
      auVar139._12_4_ = 1;
      auVar139._16_4_ = 1;
      auVar139._20_4_ = 1;
      auVar139._24_4_ = 1;
      auVar139._28_4_ = 1;
      local_540 = vpermps_avx2(auVar139,ZEXT1632(auVar6));
      auVar90 = *(undefined1 (*) [32])(bspline_basis0 + lVar24 + 0x484);
      local_560 = vbroadcastss_avx512vl(auVar7);
      local_580 = vpermps_avx2(auVar139,ZEXT1632(auVar7));
      auVar91 = *(undefined1 (*) [32])(bspline_basis0 + lVar24 + 0x908);
      local_680 = vbroadcastss_avx512vl(auVar80);
      local_640 = vpermps_avx512vl(auVar139,ZEXT1632(auVar80));
      auVar192 = ZEXT3264(local_640);
      auVar92 = *(undefined1 (*) [32])(bspline_basis0 + lVar24 + 0xd8c);
      local_600 = vbroadcastss_avx512vl(auVar81);
      auVar194 = ZEXT3264(local_600);
      local_620 = vpermps_avx512vl(auVar139,ZEXT1632(auVar81));
      auVar195 = ZEXT3264(local_620);
      auVar95 = vmulps_avx512vl(local_600,auVar92);
      auVar94 = vmulps_avx512vl(local_620,auVar92);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar91,local_680);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar91,local_640);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar90,local_560);
      auVar82 = vfmadd231ps_fma(auVar94,auVar90,local_580);
      auVar96 = vfmadd231ps_avx512vl(auVar95,auVar93,local_500);
      auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar93,local_540);
      auVar95 = *(undefined1 (*) [32])(bspline_basis1 + lVar24);
      auVar94 = *(undefined1 (*) [32])(bspline_basis1 + lVar24 + 0x484);
      auVar103 = *(undefined1 (*) [32])(bspline_basis1 + lVar24 + 0x908);
      auVar102 = *(undefined1 (*) [32])(bspline_basis1 + lVar24 + 0xd8c);
      auVar89 = vmulps_avx512vl(local_600,auVar102);
      auVar98 = vmulps_avx512vl(local_620,auVar102);
      auVar89 = vfmadd231ps_avx512vl(auVar89,auVar103,local_680);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar103,local_640);
      auVar89 = vfmadd231ps_avx512vl(auVar89,auVar94,local_560);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar94,local_580);
      auVar89 = vfmadd231ps_avx512vl(auVar89,auVar95,local_500);
      auVar8 = vfmadd231ps_fma(auVar98,auVar95,local_540);
      auVar98 = vsubps_avx512vl(auVar89,auVar96);
      auVar99 = vsubps_avx512vl(ZEXT1632(auVar8),auVar97);
      auVar87 = vmulps_avx512vl(auVar97,auVar98);
      auVar88 = vmulps_avx512vl(auVar96,auVar99);
      auVar87 = vsubps_avx512vl(auVar87,auVar88);
      auVar82 = vshufps_avx(local_650,local_650,0xff);
      uVar142 = auVar84._0_8_;
      local_a0._8_8_ = uVar142;
      local_a0._0_8_ = uVar142;
      local_a0._16_8_ = uVar142;
      local_a0._24_8_ = uVar142;
      local_c0 = vbroadcastsd_avx512vl(auVar82);
      auVar82 = vshufps_avx512vl(local_660,local_660,0xff);
      local_e0 = vbroadcastsd_avx512vl(auVar82);
      auVar82 = vshufps_avx512vl(_local_490,_local_490,0xff);
      uVar142 = auVar82._0_8_;
      register0x000012c8 = uVar142;
      local_100 = uVar142;
      register0x000012d0 = uVar142;
      register0x000012d8 = uVar142;
      auVar88 = vmulps_avx512vl(_local_100,auVar92);
      auVar88 = vfmadd231ps_avx512vl(auVar88,auVar91,local_e0);
      auVar88 = vfmadd231ps_avx512vl(auVar88,auVar90,local_c0);
      auVar88 = vfmadd231ps_avx512vl(auVar88,auVar93,local_a0);
      auVar100 = vmulps_avx512vl(_local_100,auVar102);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar103,local_e0);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar94,local_c0);
      auVar9 = vfmadd231ps_fma(auVar100,auVar95,local_a0);
      auVar100 = vmulps_avx512vl(auVar99,auVar99);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar98,auVar98);
      auVar101 = vmaxps_avx512vl(auVar88,ZEXT1632(auVar9));
      auVar101 = vmulps_avx512vl(auVar101,auVar101);
      auVar100 = vmulps_avx512vl(auVar101,auVar100);
      auVar87 = vmulps_avx512vl(auVar87,auVar87);
      uVar142 = vcmpps_avx512vl(auVar87,auVar100,2);
      auVar82 = vblendps_avx(auVar6,auVar22,8);
      auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar84 = vandps_avx512vl(auVar82,auVar83);
      auVar82 = vblendps_avx(auVar7,local_650,8);
      auVar82 = vandps_avx512vl(auVar82,auVar83);
      auVar84 = vmaxps_avx(auVar84,auVar82);
      auVar82 = vblendps_avx(auVar80,local_660,8);
      auVar85 = vandps_avx512vl(auVar82,auVar83);
      auVar82 = vblendps_avx(auVar81,_local_490,8);
      auVar82 = vandps_avx512vl(auVar82,auVar83);
      auVar82 = vmaxps_avx(auVar85,auVar82);
      auVar82 = vmaxps_avx(auVar84,auVar82);
      auVar84 = vmovshdup_avx(auVar82);
      auVar84 = vmaxss_avx(auVar84,auVar82);
      auVar82 = vshufpd_avx(auVar82,auVar82,1);
      auVar82 = vmaxss_avx(auVar82,auVar84);
      auVar84 = vcvtsi2ss_avx512f(local_660,iVar11);
      local_460._0_16_ = auVar84;
      auVar176._0_4_ = auVar84._0_4_;
      auVar176._4_4_ = auVar176._0_4_;
      auVar176._8_4_ = auVar176._0_4_;
      auVar176._12_4_ = auVar176._0_4_;
      auVar176._16_4_ = auVar176._0_4_;
      auVar176._20_4_ = auVar176._0_4_;
      auVar176._24_4_ = auVar176._0_4_;
      auVar176._28_4_ = auVar176._0_4_;
      uVar23 = vcmpps_avx512vl(auVar176,_DAT_01faff40,0xe);
      bVar77 = (byte)uVar142 & (byte)uVar23;
      local_400 = auVar82._0_4_ * 4.7683716e-07;
      auVar148._8_4_ = 2;
      auVar148._0_8_ = 0x200000002;
      auVar148._12_4_ = 2;
      auVar148._16_4_ = 2;
      auVar148._20_4_ = 2;
      auVar148._24_4_ = 2;
      auVar148._28_4_ = 2;
      local_120 = vpermps_avx512vl(auVar148,ZEXT1632(auVar6));
      local_140 = vpermps_avx512vl(auVar148,ZEXT1632(auVar7));
      local_160 = vpermps_avx512vl(auVar148,ZEXT1632(auVar80));
      local_5e0 = vpermps_avx2(auVar148,ZEXT1632(auVar81));
      uVar134 = *(undefined4 *)(ray + k * 4 + 0x60);
      fStack_3fc = 0.0;
      fStack_3f8 = 0.0;
      fStack_3f4 = 0.0;
      auVar82 = auVar99._0_16_;
      if (bVar77 == 0) {
        uVar71 = 0;
        auVar82 = vxorps_avx512vl(auVar82,auVar82);
        auVar191 = ZEXT1664(auVar82);
        auVar188 = ZEXT3264(local_500);
        auVar189 = ZEXT3264(local_540);
        auVar190 = ZEXT3264(local_560);
        auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar193 = ZEXT3264(auVar93);
        auVar187 = ZEXT3264(local_580);
        auVar186 = ZEXT3264(local_680);
      }
      else {
        auVar102 = vmulps_avx512vl(local_5e0,auVar102);
        auVar103 = vfmadd213ps_avx512vl(auVar103,local_160,auVar102);
        auVar94 = vfmadd213ps_avx512vl(auVar94,local_140,auVar103);
        auVar94 = vfmadd213ps_avx512vl(auVar95,local_120,auVar94);
        auVar92 = vmulps_avx512vl(local_5e0,auVar92);
        auVar91 = vfmadd213ps_avx512vl(auVar91,local_160,auVar92);
        auVar103 = vfmadd213ps_avx512vl(auVar90,local_140,auVar91);
        auVar90 = *(undefined1 (*) [32])(bspline_basis0 + lVar24 + 0x1210);
        auVar91 = *(undefined1 (*) [32])(bspline_basis0 + lVar24 + 0x1694);
        auVar92 = *(undefined1 (*) [32])(bspline_basis0 + lVar24 + 0x1b18);
        auVar95 = *(undefined1 (*) [32])(bspline_basis0 + lVar24 + 0x1f9c);
        auVar103 = vfmadd213ps_avx512vl(auVar93,local_120,auVar103);
        auVar93 = vmulps_avx512vl(local_600,auVar95);
        auVar102 = vmulps_avx512vl(local_620,auVar95);
        auVar95 = vmulps_avx512vl(local_5e0,auVar95);
        auVar84 = vfmadd231ps_fma(auVar93,auVar92,local_680);
        auVar93 = vfmadd231ps_avx512vl(auVar102,auVar92,local_640);
        auVar92 = vfmadd231ps_avx512vl(auVar95,local_160,auVar92);
        auVar95 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),auVar91,local_560);
        auVar187 = ZEXT3264(local_580);
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar91,local_580);
        auVar102 = vfmadd231ps_avx512vl(auVar92,local_140,auVar91);
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar90,local_500);
        auVar87 = vfmadd231ps_avx512vl(auVar93,auVar90,local_540);
        auVar93 = *(undefined1 (*) [32])(bspline_basis1 + lVar24 + 0x1210);
        auVar91 = *(undefined1 (*) [32])(bspline_basis1 + lVar24 + 0x1b18);
        auVar92 = *(undefined1 (*) [32])(bspline_basis1 + lVar24 + 0x1f9c);
        auVar102 = vfmadd231ps_avx512vl(auVar102,local_120,auVar90);
        auVar90 = vmulps_avx512vl(local_600,auVar92);
        auVar100 = vmulps_avx512vl(local_620,auVar92);
        auVar92 = vmulps_avx512vl(local_5e0,auVar92);
        auVar84 = vfmadd231ps_fma(auVar90,auVar91,local_680);
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar91,local_640);
        auVar91 = vfmadd231ps_avx512vl(auVar92,local_160,auVar91);
        auVar90 = *(undefined1 (*) [32])(bspline_basis1 + lVar24 + 0x1694);
        auVar92 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),auVar90,local_560);
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar90,local_580);
        auVar90 = vfmadd231ps_avx512vl(auVar91,local_140,auVar90);
        auVar91 = vfmadd231ps_avx512vl(auVar92,auVar93,local_500);
        auVar92 = vfmadd231ps_avx512vl(auVar100,auVar93,local_540);
        auVar100 = vfmadd231ps_avx512vl(auVar90,local_120,auVar93);
        auVar184._8_4_ = 0x7fffffff;
        auVar184._0_8_ = 0x7fffffff7fffffff;
        auVar184._12_4_ = 0x7fffffff;
        auVar184._16_4_ = 0x7fffffff;
        auVar184._20_4_ = 0x7fffffff;
        auVar184._24_4_ = 0x7fffffff;
        auVar184._28_4_ = 0x7fffffff;
        auVar93 = vandps_avx(auVar95,auVar184);
        auVar90 = vandps_avx(auVar87,auVar184);
        auVar90 = vmaxps_avx(auVar93,auVar90);
        auVar93 = vandps_avx(auVar102,auVar184);
        auVar93 = vmaxps_avx(auVar90,auVar93);
        auVar102 = vbroadcastss_avx512vl(ZEXT416((uint)local_400));
        uVar71 = vcmpps_avx512vl(auVar93,auVar102,1);
        bVar14 = (bool)((byte)uVar71 & 1);
        auVar104._0_4_ = (float)((uint)bVar14 * auVar98._0_4_ | (uint)!bVar14 * auVar95._0_4_);
        bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar104._4_4_ = (float)((uint)bVar14 * auVar98._4_4_ | (uint)!bVar14 * auVar95._4_4_);
        bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar104._8_4_ = (float)((uint)bVar14 * auVar98._8_4_ | (uint)!bVar14 * auVar95._8_4_);
        bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar104._12_4_ = (float)((uint)bVar14 * auVar98._12_4_ | (uint)!bVar14 * auVar95._12_4_);
        bVar14 = (bool)((byte)(uVar71 >> 4) & 1);
        auVar104._16_4_ = (float)((uint)bVar14 * auVar98._16_4_ | (uint)!bVar14 * auVar95._16_4_);
        bVar14 = (bool)((byte)(uVar71 >> 5) & 1);
        auVar104._20_4_ = (float)((uint)bVar14 * auVar98._20_4_ | (uint)!bVar14 * auVar95._20_4_);
        bVar14 = (bool)((byte)(uVar71 >> 6) & 1);
        auVar104._24_4_ = (float)((uint)bVar14 * auVar98._24_4_ | (uint)!bVar14 * auVar95._24_4_);
        bVar14 = SUB81(uVar71 >> 7,0);
        auVar104._28_4_ = (uint)bVar14 * auVar98._28_4_ | (uint)!bVar14 * auVar95._28_4_;
        bVar14 = (bool)((byte)uVar71 & 1);
        auVar105._0_4_ = (float)((uint)bVar14 * auVar99._0_4_ | (uint)!bVar14 * auVar87._0_4_);
        bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar105._4_4_ = (float)((uint)bVar14 * auVar99._4_4_ | (uint)!bVar14 * auVar87._4_4_);
        bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar105._8_4_ = (float)((uint)bVar14 * auVar99._8_4_ | (uint)!bVar14 * auVar87._8_4_);
        bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar105._12_4_ = (float)((uint)bVar14 * auVar99._12_4_ | (uint)!bVar14 * auVar87._12_4_);
        bVar14 = (bool)((byte)(uVar71 >> 4) & 1);
        auVar105._16_4_ = (float)((uint)bVar14 * auVar99._16_4_ | (uint)!bVar14 * auVar87._16_4_);
        bVar14 = (bool)((byte)(uVar71 >> 5) & 1);
        auVar105._20_4_ = (float)((uint)bVar14 * auVar99._20_4_ | (uint)!bVar14 * auVar87._20_4_);
        bVar14 = (bool)((byte)(uVar71 >> 6) & 1);
        auVar105._24_4_ = (float)((uint)bVar14 * auVar99._24_4_ | (uint)!bVar14 * auVar87._24_4_);
        bVar14 = SUB81(uVar71 >> 7,0);
        auVar105._28_4_ = (uint)bVar14 * auVar99._28_4_ | (uint)!bVar14 * auVar87._28_4_;
        auVar93 = vandps_avx(auVar184,auVar91);
        auVar90 = vandps_avx(auVar92,auVar184);
        auVar90 = vmaxps_avx(auVar93,auVar90);
        auVar93 = vandps_avx(auVar100,auVar184);
        auVar93 = vmaxps_avx(auVar90,auVar93);
        uVar71 = vcmpps_avx512vl(auVar93,auVar102,1);
        bVar14 = (bool)((byte)uVar71 & 1);
        auVar106._0_4_ = (float)((uint)bVar14 * auVar98._0_4_ | (uint)!bVar14 * auVar91._0_4_);
        bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar106._4_4_ = (float)((uint)bVar14 * auVar98._4_4_ | (uint)!bVar14 * auVar91._4_4_);
        bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar106._8_4_ = (float)((uint)bVar14 * auVar98._8_4_ | (uint)!bVar14 * auVar91._8_4_);
        bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar106._12_4_ = (float)((uint)bVar14 * auVar98._12_4_ | (uint)!bVar14 * auVar91._12_4_);
        bVar14 = (bool)((byte)(uVar71 >> 4) & 1);
        auVar106._16_4_ = (float)((uint)bVar14 * auVar98._16_4_ | (uint)!bVar14 * auVar91._16_4_);
        bVar14 = (bool)((byte)(uVar71 >> 5) & 1);
        auVar106._20_4_ = (float)((uint)bVar14 * auVar98._20_4_ | (uint)!bVar14 * auVar91._20_4_);
        bVar14 = (bool)((byte)(uVar71 >> 6) & 1);
        auVar106._24_4_ = (float)((uint)bVar14 * auVar98._24_4_ | (uint)!bVar14 * auVar91._24_4_);
        bVar14 = SUB81(uVar71 >> 7,0);
        auVar106._28_4_ = (uint)bVar14 * auVar98._28_4_ | (uint)!bVar14 * auVar91._28_4_;
        bVar14 = (bool)((byte)uVar71 & 1);
        auVar107._0_4_ = (float)((uint)bVar14 * auVar99._0_4_ | (uint)!bVar14 * auVar92._0_4_);
        bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar107._4_4_ = (float)((uint)bVar14 * auVar99._4_4_ | (uint)!bVar14 * auVar92._4_4_);
        bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar107._8_4_ = (float)((uint)bVar14 * auVar99._8_4_ | (uint)!bVar14 * auVar92._8_4_);
        bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar107._12_4_ = (float)((uint)bVar14 * auVar99._12_4_ | (uint)!bVar14 * auVar92._12_4_);
        bVar14 = (bool)((byte)(uVar71 >> 4) & 1);
        auVar107._16_4_ = (float)((uint)bVar14 * auVar99._16_4_ | (uint)!bVar14 * auVar92._16_4_);
        bVar14 = (bool)((byte)(uVar71 >> 5) & 1);
        auVar107._20_4_ = (float)((uint)bVar14 * auVar99._20_4_ | (uint)!bVar14 * auVar92._20_4_);
        bVar14 = (bool)((byte)(uVar71 >> 6) & 1);
        auVar107._24_4_ = (float)((uint)bVar14 * auVar99._24_4_ | (uint)!bVar14 * auVar92._24_4_);
        bVar14 = SUB81(uVar71 >> 7,0);
        auVar107._28_4_ = (uint)bVar14 * auVar99._28_4_ | (uint)!bVar14 * auVar92._28_4_;
        auVar86 = vxorps_avx512vl(auVar82,auVar82);
        auVar191 = ZEXT1664(auVar86);
        auVar93 = vfmadd213ps_avx512vl(auVar104,auVar104,ZEXT1632(auVar86));
        auVar82 = vfmadd231ps_fma(auVar93,auVar105,auVar105);
        auVar93 = vrsqrt14ps_avx512vl(ZEXT1632(auVar82));
        fVar150 = auVar93._0_4_;
        fVar133 = auVar93._4_4_;
        fVar140 = auVar93._8_4_;
        fVar141 = auVar93._12_4_;
        fVar167 = auVar93._16_4_;
        fVar169 = auVar93._20_4_;
        fVar78 = auVar93._24_4_;
        auVar33._4_4_ = fVar133 * fVar133 * fVar133 * auVar82._4_4_ * -0.5;
        auVar33._0_4_ = fVar150 * fVar150 * fVar150 * auVar82._0_4_ * -0.5;
        auVar33._8_4_ = fVar140 * fVar140 * fVar140 * auVar82._8_4_ * -0.5;
        auVar33._12_4_ = fVar141 * fVar141 * fVar141 * auVar82._12_4_ * -0.5;
        auVar33._16_4_ = fVar167 * fVar167 * fVar167 * -0.0;
        auVar33._20_4_ = fVar169 * fVar169 * fVar169 * -0.0;
        auVar33._24_4_ = fVar78 * fVar78 * fVar78 * -0.0;
        auVar33._28_4_ = 0;
        auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar91 = vfmadd231ps_avx512vl(auVar33,auVar90,auVar93);
        auVar34._4_4_ = auVar105._4_4_ * auVar91._4_4_;
        auVar34._0_4_ = auVar105._0_4_ * auVar91._0_4_;
        auVar34._8_4_ = auVar105._8_4_ * auVar91._8_4_;
        auVar34._12_4_ = auVar105._12_4_ * auVar91._12_4_;
        auVar34._16_4_ = auVar105._16_4_ * auVar91._16_4_;
        auVar34._20_4_ = auVar105._20_4_ * auVar91._20_4_;
        auVar34._24_4_ = auVar105._24_4_ * auVar91._24_4_;
        auVar34._28_4_ = auVar93._28_4_;
        auVar35._4_4_ = auVar91._4_4_ * -auVar104._4_4_;
        auVar35._0_4_ = auVar91._0_4_ * -auVar104._0_4_;
        auVar35._8_4_ = auVar91._8_4_ * -auVar104._8_4_;
        auVar35._12_4_ = auVar91._12_4_ * -auVar104._12_4_;
        auVar35._16_4_ = auVar91._16_4_ * -auVar104._16_4_;
        auVar35._20_4_ = auVar91._20_4_ * -auVar104._20_4_;
        auVar35._24_4_ = auVar91._24_4_ * -auVar104._24_4_;
        auVar35._28_4_ = auVar104._28_4_ ^ 0x80000000;
        auVar93 = vmulps_avx512vl(auVar91,ZEXT1632(auVar86));
        auVar98 = ZEXT1632(auVar86);
        auVar92 = vfmadd213ps_avx512vl(auVar106,auVar106,auVar98);
        auVar82 = vfmadd231ps_fma(auVar92,auVar107,auVar107);
        auVar92 = vrsqrt14ps_avx512vl(ZEXT1632(auVar82));
        fVar150 = auVar92._0_4_;
        fVar133 = auVar92._4_4_;
        fVar140 = auVar92._8_4_;
        fVar141 = auVar92._12_4_;
        fVar167 = auVar92._16_4_;
        fVar169 = auVar92._20_4_;
        fVar78 = auVar92._24_4_;
        auVar36._4_4_ = fVar133 * fVar133 * fVar133 * auVar82._4_4_ * -0.5;
        auVar36._0_4_ = fVar150 * fVar150 * fVar150 * auVar82._0_4_ * -0.5;
        auVar36._8_4_ = fVar140 * fVar140 * fVar140 * auVar82._8_4_ * -0.5;
        auVar36._12_4_ = fVar141 * fVar141 * fVar141 * auVar82._12_4_ * -0.5;
        auVar36._16_4_ = fVar167 * fVar167 * fVar167 * -0.0;
        auVar36._20_4_ = fVar169 * fVar169 * fVar169 * -0.0;
        auVar36._24_4_ = fVar78 * fVar78 * fVar78 * -0.0;
        auVar36._28_4_ = 0;
        auVar90 = vfmadd231ps_avx512vl(auVar36,auVar90,auVar92);
        auVar37._4_4_ = auVar107._4_4_ * auVar90._4_4_;
        auVar37._0_4_ = auVar107._0_4_ * auVar90._0_4_;
        auVar37._8_4_ = auVar107._8_4_ * auVar90._8_4_;
        auVar37._12_4_ = auVar107._12_4_ * auVar90._12_4_;
        auVar37._16_4_ = auVar107._16_4_ * auVar90._16_4_;
        auVar37._20_4_ = auVar107._20_4_ * auVar90._20_4_;
        auVar37._24_4_ = auVar107._24_4_ * auVar90._24_4_;
        auVar37._28_4_ = auVar92._28_4_;
        auVar38._4_4_ = -auVar106._4_4_ * auVar90._4_4_;
        auVar38._0_4_ = -auVar106._0_4_ * auVar90._0_4_;
        auVar38._8_4_ = -auVar106._8_4_ * auVar90._8_4_;
        auVar38._12_4_ = -auVar106._12_4_ * auVar90._12_4_;
        auVar38._16_4_ = -auVar106._16_4_ * auVar90._16_4_;
        auVar38._20_4_ = -auVar106._20_4_ * auVar90._20_4_;
        auVar38._24_4_ = -auVar106._24_4_ * auVar90._24_4_;
        auVar38._28_4_ = auVar91._28_4_;
        auVar90 = vmulps_avx512vl(auVar90,auVar98);
        auVar82 = vfmadd213ps_fma(auVar34,auVar88,auVar96);
        auVar84 = vfmadd213ps_fma(auVar35,auVar88,auVar97);
        auVar91 = vfmadd213ps_avx512vl(auVar93,auVar88,auVar103);
        auVar92 = vfmadd213ps_avx512vl(auVar37,ZEXT1632(auVar9),auVar89);
        auVar83 = vfnmadd213ps_fma(auVar34,auVar88,auVar96);
        auVar102 = ZEXT1632(auVar9);
        auVar81 = vfmadd213ps_fma(auVar38,auVar102,ZEXT1632(auVar8));
        auVar85 = vfnmadd213ps_fma(auVar35,auVar88,auVar97);
        auVar80 = vfmadd213ps_fma(auVar90,auVar102,auVar94);
        auVar95 = vfnmadd231ps_avx512vl(auVar103,auVar88,auVar93);
        auVar151 = vfnmadd213ps_fma(auVar37,auVar102,auVar89);
        auVar8 = vfnmadd213ps_fma(auVar38,auVar102,ZEXT1632(auVar8));
        auVar152 = vfnmadd231ps_fma(auVar94,ZEXT1632(auVar9),auVar90);
        auVar90 = vsubps_avx512vl(auVar92,ZEXT1632(auVar83));
        auVar93 = vsubps_avx(ZEXT1632(auVar81),ZEXT1632(auVar85));
        auVar94 = vsubps_avx512vl(ZEXT1632(auVar80),auVar95);
        auVar103 = vmulps_avx512vl(auVar93,auVar95);
        auVar6 = vfmsub231ps_fma(auVar103,ZEXT1632(auVar85),auVar94);
        auVar39._4_4_ = auVar83._4_4_ * auVar94._4_4_;
        auVar39._0_4_ = auVar83._0_4_ * auVar94._0_4_;
        auVar39._8_4_ = auVar83._8_4_ * auVar94._8_4_;
        auVar39._12_4_ = auVar83._12_4_ * auVar94._12_4_;
        auVar39._16_4_ = auVar94._16_4_ * 0.0;
        auVar39._20_4_ = auVar94._20_4_ * 0.0;
        auVar39._24_4_ = auVar94._24_4_ * 0.0;
        auVar39._28_4_ = auVar94._28_4_;
        auVar94 = vfmsub231ps_avx512vl(auVar39,auVar95,auVar90);
        auVar40._4_4_ = auVar85._4_4_ * auVar90._4_4_;
        auVar40._0_4_ = auVar85._0_4_ * auVar90._0_4_;
        auVar40._8_4_ = auVar85._8_4_ * auVar90._8_4_;
        auVar40._12_4_ = auVar85._12_4_ * auVar90._12_4_;
        auVar40._16_4_ = auVar90._16_4_ * 0.0;
        auVar40._20_4_ = auVar90._20_4_ * 0.0;
        auVar40._24_4_ = auVar90._24_4_ * 0.0;
        auVar40._28_4_ = auVar90._28_4_;
        auVar7 = vfmsub231ps_fma(auVar40,ZEXT1632(auVar83),auVar93);
        auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar7),auVar98,auVar94);
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar98,ZEXT1632(auVar6));
        auVar98 = ZEXT1632(auVar86);
        uVar71 = vcmpps_avx512vl(auVar93,auVar98,2);
        bVar70 = (byte)uVar71;
        fVar78 = (float)((uint)(bVar70 & 1) * auVar82._0_4_ |
                        (uint)!(bool)(bVar70 & 1) * auVar151._0_4_);
        bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
        fVar149 = (float)((uint)bVar14 * auVar82._4_4_ | (uint)!bVar14 * auVar151._4_4_);
        bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
        fVar126 = (float)((uint)bVar14 * auVar82._8_4_ | (uint)!bVar14 * auVar151._8_4_);
        bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
        fVar129 = (float)((uint)bVar14 * auVar82._12_4_ | (uint)!bVar14 * auVar151._12_4_);
        auVar103 = ZEXT1632(CONCAT412(fVar129,CONCAT48(fVar126,CONCAT44(fVar149,fVar78))));
        fVar79 = (float)((uint)(bVar70 & 1) * auVar84._0_4_ |
                        (uint)!(bool)(bVar70 & 1) * auVar8._0_4_);
        bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
        fVar125 = (float)((uint)bVar14 * auVar84._4_4_ | (uint)!bVar14 * auVar8._4_4_);
        bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
        fVar127 = (float)((uint)bVar14 * auVar84._8_4_ | (uint)!bVar14 * auVar8._8_4_);
        bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
        fVar130 = (float)((uint)bVar14 * auVar84._12_4_ | (uint)!bVar14 * auVar8._12_4_);
        auVar102 = ZEXT1632(CONCAT412(fVar130,CONCAT48(fVar127,CONCAT44(fVar125,fVar79))));
        auVar108._0_4_ =
             (float)((uint)(bVar70 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar152._0_4_
                    );
        bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar108._4_4_ = (float)((uint)bVar14 * auVar91._4_4_ | (uint)!bVar14 * auVar152._4_4_);
        bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar108._8_4_ = (float)((uint)bVar14 * auVar91._8_4_ | (uint)!bVar14 * auVar152._8_4_);
        bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar108._12_4_ = (float)((uint)bVar14 * auVar91._12_4_ | (uint)!bVar14 * auVar152._12_4_);
        fVar133 = (float)((uint)((byte)(uVar71 >> 4) & 1) * auVar91._16_4_);
        auVar108._16_4_ = fVar133;
        fVar150 = (float)((uint)((byte)(uVar71 >> 5) & 1) * auVar91._20_4_);
        auVar108._20_4_ = fVar150;
        fVar140 = (float)((uint)((byte)(uVar71 >> 6) & 1) * auVar91._24_4_);
        auVar108._24_4_ = fVar140;
        iVar1 = (uint)(byte)(uVar71 >> 7) * auVar91._28_4_;
        auVar108._28_4_ = iVar1;
        auVar90 = vblendmps_avx512vl(ZEXT1632(auVar83),auVar92);
        auVar109._0_4_ =
             (uint)(bVar70 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar6._0_4_;
        bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar109._4_4_ = (uint)bVar14 * auVar90._4_4_ | (uint)!bVar14 * auVar6._4_4_;
        bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar109._8_4_ = (uint)bVar14 * auVar90._8_4_ | (uint)!bVar14 * auVar6._8_4_;
        bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar109._12_4_ = (uint)bVar14 * auVar90._12_4_ | (uint)!bVar14 * auVar6._12_4_;
        auVar109._16_4_ = (uint)((byte)(uVar71 >> 4) & 1) * auVar90._16_4_;
        auVar109._20_4_ = (uint)((byte)(uVar71 >> 5) & 1) * auVar90._20_4_;
        auVar109._24_4_ = (uint)((byte)(uVar71 >> 6) & 1) * auVar90._24_4_;
        auVar109._28_4_ = (uint)(byte)(uVar71 >> 7) * auVar90._28_4_;
        auVar90 = vblendmps_avx512vl(ZEXT1632(auVar85),ZEXT1632(auVar81));
        auVar110._0_4_ =
             (float)((uint)(bVar70 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar84._0_4_)
        ;
        bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar110._4_4_ = (float)((uint)bVar14 * auVar90._4_4_ | (uint)!bVar14 * auVar84._4_4_);
        bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar110._8_4_ = (float)((uint)bVar14 * auVar90._8_4_ | (uint)!bVar14 * auVar84._8_4_);
        bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar110._12_4_ = (float)((uint)bVar14 * auVar90._12_4_ | (uint)!bVar14 * auVar84._12_4_);
        fVar141 = (float)((uint)((byte)(uVar71 >> 4) & 1) * auVar90._16_4_);
        auVar110._16_4_ = fVar141;
        fVar167 = (float)((uint)((byte)(uVar71 >> 5) & 1) * auVar90._20_4_);
        auVar110._20_4_ = fVar167;
        fVar169 = (float)((uint)((byte)(uVar71 >> 6) & 1) * auVar90._24_4_);
        auVar110._24_4_ = fVar169;
        auVar110._28_4_ = (uint)(byte)(uVar71 >> 7) * auVar90._28_4_;
        auVar90 = vblendmps_avx512vl(auVar95,ZEXT1632(auVar80));
        auVar111._0_4_ =
             (float)((uint)(bVar70 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar91._0_4_)
        ;
        bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar111._4_4_ = (float)((uint)bVar14 * auVar90._4_4_ | (uint)!bVar14 * auVar91._4_4_);
        bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar111._8_4_ = (float)((uint)bVar14 * auVar90._8_4_ | (uint)!bVar14 * auVar91._8_4_);
        bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar111._12_4_ = (float)((uint)bVar14 * auVar90._12_4_ | (uint)!bVar14 * auVar91._12_4_);
        bVar14 = (bool)((byte)(uVar71 >> 4) & 1);
        auVar111._16_4_ = (float)((uint)bVar14 * auVar90._16_4_ | (uint)!bVar14 * auVar91._16_4_);
        bVar14 = (bool)((byte)(uVar71 >> 5) & 1);
        auVar111._20_4_ = (float)((uint)bVar14 * auVar90._20_4_ | (uint)!bVar14 * auVar91._20_4_);
        bVar14 = (bool)((byte)(uVar71 >> 6) & 1);
        auVar111._24_4_ = (float)((uint)bVar14 * auVar90._24_4_ | (uint)!bVar14 * auVar91._24_4_);
        bVar14 = SUB81(uVar71 >> 7,0);
        auVar111._28_4_ = (uint)bVar14 * auVar90._28_4_ | (uint)!bVar14 * auVar91._28_4_;
        auVar112._0_4_ =
             (uint)(bVar70 & 1) * (int)auVar83._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar92._0_4_;
        bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar112._4_4_ = (uint)bVar14 * (int)auVar83._4_4_ | (uint)!bVar14 * auVar92._4_4_;
        bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar112._8_4_ = (uint)bVar14 * (int)auVar83._8_4_ | (uint)!bVar14 * auVar92._8_4_;
        bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar112._12_4_ = (uint)bVar14 * (int)auVar83._12_4_ | (uint)!bVar14 * auVar92._12_4_;
        auVar112._16_4_ = (uint)!(bool)((byte)(uVar71 >> 4) & 1) * auVar92._16_4_;
        auVar112._20_4_ = (uint)!(bool)((byte)(uVar71 >> 5) & 1) * auVar92._20_4_;
        auVar112._24_4_ = (uint)!(bool)((byte)(uVar71 >> 6) & 1) * auVar92._24_4_;
        auVar112._28_4_ = (uint)!SUB81(uVar71 >> 7,0) * auVar92._28_4_;
        bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
        bVar16 = (bool)((byte)(uVar71 >> 2) & 1);
        bVar17 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar113._0_4_ =
             (uint)(bVar70 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar80._0_4_;
        bVar15 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar113._4_4_ = (uint)bVar15 * auVar95._4_4_ | (uint)!bVar15 * auVar80._4_4_;
        bVar15 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar113._8_4_ = (uint)bVar15 * auVar95._8_4_ | (uint)!bVar15 * auVar80._8_4_;
        bVar15 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar113._12_4_ = (uint)bVar15 * auVar95._12_4_ | (uint)!bVar15 * auVar80._12_4_;
        auVar113._16_4_ = (uint)((byte)(uVar71 >> 4) & 1) * auVar95._16_4_;
        auVar113._20_4_ = (uint)((byte)(uVar71 >> 5) & 1) * auVar95._20_4_;
        auVar113._24_4_ = (uint)((byte)(uVar71 >> 6) & 1) * auVar95._24_4_;
        iVar2 = (uint)(byte)(uVar71 >> 7) * auVar95._28_4_;
        auVar113._28_4_ = iVar2;
        auVar96 = vsubps_avx512vl(auVar112,auVar103);
        auVar90 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar85._12_4_ |
                                                (uint)!bVar17 * auVar81._12_4_,
                                                CONCAT48((uint)bVar16 * (int)auVar85._8_4_ |
                                                         (uint)!bVar16 * auVar81._8_4_,
                                                         CONCAT44((uint)bVar14 * (int)auVar85._4_4_
                                                                  | (uint)!bVar14 * auVar81._4_4_,
                                                                  (uint)(bVar70 & 1) *
                                                                  (int)auVar85._0_4_ |
                                                                  (uint)!(bool)(bVar70 & 1) *
                                                                  auVar81._0_4_)))),auVar102);
        auVar91 = vsubps_avx(auVar113,auVar108);
        auVar92 = vsubps_avx(auVar103,auVar109);
        auVar95 = vsubps_avx(auVar102,auVar110);
        auVar94 = vsubps_avx(auVar108,auVar111);
        auVar41._4_4_ = auVar91._4_4_ * fVar149;
        auVar41._0_4_ = auVar91._0_4_ * fVar78;
        auVar41._8_4_ = auVar91._8_4_ * fVar126;
        auVar41._12_4_ = auVar91._12_4_ * fVar129;
        auVar41._16_4_ = auVar91._16_4_ * 0.0;
        auVar41._20_4_ = auVar91._20_4_ * 0.0;
        auVar41._24_4_ = auVar91._24_4_ * 0.0;
        auVar41._28_4_ = iVar2;
        auVar82 = vfmsub231ps_fma(auVar41,auVar108,auVar96);
        auVar42._4_4_ = fVar125 * auVar96._4_4_;
        auVar42._0_4_ = fVar79 * auVar96._0_4_;
        auVar42._8_4_ = fVar127 * auVar96._8_4_;
        auVar42._12_4_ = fVar130 * auVar96._12_4_;
        auVar42._16_4_ = auVar96._16_4_ * 0.0;
        auVar42._20_4_ = auVar96._20_4_ * 0.0;
        auVar42._24_4_ = auVar96._24_4_ * 0.0;
        auVar42._28_4_ = auVar93._28_4_;
        auVar84 = vfmsub231ps_fma(auVar42,auVar103,auVar90);
        auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),auVar98,ZEXT1632(auVar82));
        auVar157._0_4_ = auVar90._0_4_ * auVar108._0_4_;
        auVar157._4_4_ = auVar90._4_4_ * auVar108._4_4_;
        auVar157._8_4_ = auVar90._8_4_ * auVar108._8_4_;
        auVar157._12_4_ = auVar90._12_4_ * auVar108._12_4_;
        auVar157._16_4_ = auVar90._16_4_ * fVar133;
        auVar157._20_4_ = auVar90._20_4_ * fVar150;
        auVar157._24_4_ = auVar90._24_4_ * fVar140;
        auVar157._28_4_ = 0;
        auVar82 = vfmsub231ps_fma(auVar157,auVar102,auVar91);
        auVar97 = vfmadd231ps_avx512vl(auVar93,auVar98,ZEXT1632(auVar82));
        auVar93 = vmulps_avx512vl(auVar94,auVar109);
        auVar93 = vfmsub231ps_avx512vl(auVar93,auVar92,auVar111);
        auVar43._4_4_ = auVar95._4_4_ * auVar111._4_4_;
        auVar43._0_4_ = auVar95._0_4_ * auVar111._0_4_;
        auVar43._8_4_ = auVar95._8_4_ * auVar111._8_4_;
        auVar43._12_4_ = auVar95._12_4_ * auVar111._12_4_;
        auVar43._16_4_ = auVar95._16_4_ * auVar111._16_4_;
        auVar43._20_4_ = auVar95._20_4_ * auVar111._20_4_;
        auVar43._24_4_ = auVar95._24_4_ * auVar111._24_4_;
        auVar43._28_4_ = auVar111._28_4_;
        auVar82 = vfmsub231ps_fma(auVar43,auVar110,auVar94);
        auVar158._0_4_ = auVar110._0_4_ * auVar92._0_4_;
        auVar158._4_4_ = auVar110._4_4_ * auVar92._4_4_;
        auVar158._8_4_ = auVar110._8_4_ * auVar92._8_4_;
        auVar158._12_4_ = auVar110._12_4_ * auVar92._12_4_;
        auVar158._16_4_ = fVar141 * auVar92._16_4_;
        auVar158._20_4_ = fVar167 * auVar92._20_4_;
        auVar158._24_4_ = fVar169 * auVar92._24_4_;
        auVar158._28_4_ = 0;
        auVar84 = vfmsub231ps_fma(auVar158,auVar95,auVar109);
        auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),auVar98,auVar93);
        auVar89 = vfmadd231ps_avx512vl(auVar93,auVar98,ZEXT1632(auVar82));
        auVar93 = vmaxps_avx(auVar97,auVar89);
        uVar142 = vcmpps_avx512vl(auVar93,auVar98,2);
        bVar77 = bVar77 & (byte)uVar142;
        auVar188 = ZEXT3264(local_500);
        auVar189 = ZEXT3264(local_540);
        auVar190 = ZEXT3264(local_560);
        auVar186 = ZEXT3264(local_680);
        if (bVar77 == 0) {
          uVar71 = 0;
          auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar193 = ZEXT3264(auVar93);
          auVar192 = ZEXT3264(local_640);
          auVar194 = ZEXT3264(local_600);
          auVar195 = ZEXT3264(local_620);
        }
        else {
          uVar3 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar179._4_4_ = uVar3;
          auVar179._0_4_ = uVar3;
          auVar179._8_4_ = uVar3;
          auVar179._12_4_ = uVar3;
          auVar179._16_4_ = uVar3;
          auVar179._20_4_ = uVar3;
          auVar179._24_4_ = uVar3;
          auVar179._28_4_ = uVar3;
          auVar181 = ZEXT3264(auVar179);
          auVar44._4_4_ = auVar94._4_4_ * auVar90._4_4_;
          auVar44._0_4_ = auVar94._0_4_ * auVar90._0_4_;
          auVar44._8_4_ = auVar94._8_4_ * auVar90._8_4_;
          auVar44._12_4_ = auVar94._12_4_ * auVar90._12_4_;
          auVar44._16_4_ = auVar94._16_4_ * auVar90._16_4_;
          auVar44._20_4_ = auVar94._20_4_ * auVar90._20_4_;
          auVar44._24_4_ = auVar94._24_4_ * auVar90._24_4_;
          auVar44._28_4_ = auVar93._28_4_;
          auVar81 = vfmsub231ps_fma(auVar44,auVar95,auVar91);
          auVar45._4_4_ = auVar91._4_4_ * auVar92._4_4_;
          auVar45._0_4_ = auVar91._0_4_ * auVar92._0_4_;
          auVar45._8_4_ = auVar91._8_4_ * auVar92._8_4_;
          auVar45._12_4_ = auVar91._12_4_ * auVar92._12_4_;
          auVar45._16_4_ = auVar91._16_4_ * auVar92._16_4_;
          auVar45._20_4_ = auVar91._20_4_ * auVar92._20_4_;
          auVar45._24_4_ = auVar91._24_4_ * auVar92._24_4_;
          auVar45._28_4_ = auVar91._28_4_;
          auVar84 = vfmsub231ps_fma(auVar45,auVar96,auVar94);
          auVar46._4_4_ = auVar95._4_4_ * auVar96._4_4_;
          auVar46._0_4_ = auVar95._0_4_ * auVar96._0_4_;
          auVar46._8_4_ = auVar95._8_4_ * auVar96._8_4_;
          auVar46._12_4_ = auVar95._12_4_ * auVar96._12_4_;
          auVar46._16_4_ = auVar95._16_4_ * auVar96._16_4_;
          auVar46._20_4_ = auVar95._20_4_ * auVar96._20_4_;
          auVar46._24_4_ = auVar95._24_4_ * auVar96._24_4_;
          auVar46._28_4_ = auVar95._28_4_;
          auVar80 = vfmsub231ps_fma(auVar46,auVar92,auVar90);
          auVar82 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar84),ZEXT1632(auVar80));
          auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),ZEXT1632(auVar81),auVar98);
          auVar90 = vrcp14ps_avx512vl(auVar93);
          auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar193 = ZEXT3264(auVar91);
          auVar92 = vfnmadd213ps_avx512vl(auVar90,auVar93,auVar91);
          auVar82 = vfmadd132ps_fma(auVar92,auVar90,auVar90);
          auVar47._4_4_ = auVar80._4_4_ * auVar108._4_4_;
          auVar47._0_4_ = auVar80._0_4_ * auVar108._0_4_;
          auVar47._8_4_ = auVar80._8_4_ * auVar108._8_4_;
          auVar47._12_4_ = auVar80._12_4_ * auVar108._12_4_;
          auVar47._16_4_ = fVar133 * 0.0;
          auVar47._20_4_ = fVar150 * 0.0;
          auVar47._24_4_ = fVar140 * 0.0;
          auVar47._28_4_ = iVar1;
          auVar84 = vfmadd231ps_fma(auVar47,auVar102,ZEXT1632(auVar84));
          auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar103,ZEXT1632(auVar81));
          fVar150 = auVar82._0_4_;
          fVar133 = auVar82._4_4_;
          fVar140 = auVar82._8_4_;
          fVar141 = auVar82._12_4_;
          local_3a0 = ZEXT1632(CONCAT412(auVar84._12_4_ * fVar141,
                                         CONCAT48(auVar84._8_4_ * fVar140,
                                                  CONCAT44(auVar84._4_4_ * fVar133,
                                                           auVar84._0_4_ * fVar150))));
          auVar171._4_4_ = uVar134;
          auVar171._0_4_ = uVar134;
          auVar171._8_4_ = uVar134;
          auVar171._12_4_ = uVar134;
          auVar171._16_4_ = uVar134;
          auVar171._20_4_ = uVar134;
          auVar171._24_4_ = uVar134;
          auVar171._28_4_ = uVar134;
          uVar142 = vcmpps_avx512vl(local_3a0,auVar179,2);
          uVar23 = vcmpps_avx512vl(auVar171,local_3a0,2);
          bVar77 = (byte)uVar142 & (byte)uVar23 & bVar77;
          auVar194 = ZEXT3264(local_600);
          auVar195 = ZEXT3264(local_620);
          if (bVar77 == 0) {
            uVar71 = 0;
            auVar192 = ZEXT3264(local_640);
          }
          else {
            uVar142 = vcmpps_avx512vl(auVar93,auVar98,4);
            bVar77 = bVar77 & (byte)uVar142;
            auVar192 = ZEXT3264(local_640);
            if (bVar77 != 0) {
              fVar167 = auVar97._0_4_ * fVar150;
              fVar169 = auVar97._4_4_ * fVar133;
              auVar48._4_4_ = fVar169;
              auVar48._0_4_ = fVar167;
              fVar78 = auVar97._8_4_ * fVar140;
              auVar48._8_4_ = fVar78;
              fVar79 = auVar97._12_4_ * fVar141;
              auVar48._12_4_ = fVar79;
              fVar149 = auVar97._16_4_ * 0.0;
              auVar48._16_4_ = fVar149;
              fVar125 = auVar97._20_4_ * 0.0;
              auVar48._20_4_ = fVar125;
              fVar126 = auVar97._24_4_ * 0.0;
              auVar48._24_4_ = fVar126;
              auVar48._28_4_ = auVar93._28_4_;
              auVar90 = vsubps_avx512vl(auVar91,auVar48);
              local_3e0._0_4_ =
                   (float)((uint)(bVar70 & 1) * (int)fVar167 |
                          (uint)!(bool)(bVar70 & 1) * auVar90._0_4_);
              bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
              local_3e0._4_4_ = (float)((uint)bVar14 * (int)fVar169 | (uint)!bVar14 * auVar90._4_4_)
              ;
              bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
              local_3e0._8_4_ = (float)((uint)bVar14 * (int)fVar78 | (uint)!bVar14 * auVar90._8_4_);
              bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
              local_3e0._12_4_ =
                   (float)((uint)bVar14 * (int)fVar79 | (uint)!bVar14 * auVar90._12_4_);
              bVar14 = (bool)((byte)(uVar71 >> 4) & 1);
              local_3e0._16_4_ =
                   (float)((uint)bVar14 * (int)fVar149 | (uint)!bVar14 * auVar90._16_4_);
              bVar14 = (bool)((byte)(uVar71 >> 5) & 1);
              local_3e0._20_4_ =
                   (float)((uint)bVar14 * (int)fVar125 | (uint)!bVar14 * auVar90._20_4_);
              bVar14 = (bool)((byte)(uVar71 >> 6) & 1);
              local_3e0._24_4_ =
                   (float)((uint)bVar14 * (int)fVar126 | (uint)!bVar14 * auVar90._24_4_);
              bVar14 = SUB81(uVar71 >> 7,0);
              local_3e0._28_4_ =
                   (float)((uint)bVar14 * auVar93._28_4_ | (uint)!bVar14 * auVar90._28_4_);
              auVar93 = vsubps_avx(ZEXT1632(auVar9),auVar88);
              auVar82 = vfmadd213ps_fma(auVar93,local_3e0,auVar88);
              uVar3 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
              auVar28._4_4_ = uVar3;
              auVar28._0_4_ = uVar3;
              auVar28._8_4_ = uVar3;
              auVar28._12_4_ = uVar3;
              auVar28._16_4_ = uVar3;
              auVar28._20_4_ = uVar3;
              auVar28._24_4_ = uVar3;
              auVar28._28_4_ = uVar3;
              auVar93 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar82._12_4_ + auVar82._12_4_,
                                                           CONCAT48(auVar82._8_4_ + auVar82._8_4_,
                                                                    CONCAT44(auVar82._4_4_ +
                                                                             auVar82._4_4_,
                                                                             auVar82._0_4_ +
                                                                             auVar82._0_4_)))),
                                        auVar28);
              uVar142 = vcmpps_avx512vl(local_3a0,auVar93,6);
              if (((byte)uVar142 & bVar77) != 0) {
                auVar153._0_4_ = auVar89._0_4_ * fVar150;
                auVar153._4_4_ = auVar89._4_4_ * fVar133;
                auVar153._8_4_ = auVar89._8_4_ * fVar140;
                auVar153._12_4_ = auVar89._12_4_ * fVar141;
                auVar153._16_4_ = auVar89._16_4_ * 0.0;
                auVar153._20_4_ = auVar89._20_4_ * 0.0;
                auVar153._24_4_ = auVar89._24_4_ * 0.0;
                auVar153._28_4_ = 0;
                auVar93 = vsubps_avx512vl(auVar91,auVar153);
                auVar114._0_4_ =
                     (uint)(bVar70 & 1) * (int)auVar153._0_4_ |
                     (uint)!(bool)(bVar70 & 1) * auVar93._0_4_;
                bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
                auVar114._4_4_ = (uint)bVar14 * (int)auVar153._4_4_ | (uint)!bVar14 * auVar93._4_4_;
                bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
                auVar114._8_4_ = (uint)bVar14 * (int)auVar153._8_4_ | (uint)!bVar14 * auVar93._8_4_;
                bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
                auVar114._12_4_ =
                     (uint)bVar14 * (int)auVar153._12_4_ | (uint)!bVar14 * auVar93._12_4_;
                bVar14 = (bool)((byte)(uVar71 >> 4) & 1);
                auVar114._16_4_ =
                     (uint)bVar14 * (int)auVar153._16_4_ | (uint)!bVar14 * auVar93._16_4_;
                bVar14 = (bool)((byte)(uVar71 >> 5) & 1);
                auVar114._20_4_ =
                     (uint)bVar14 * (int)auVar153._20_4_ | (uint)!bVar14 * auVar93._20_4_;
                bVar14 = (bool)((byte)(uVar71 >> 6) & 1);
                auVar114._24_4_ =
                     (uint)bVar14 * (int)auVar153._24_4_ | (uint)!bVar14 * auVar93._24_4_;
                auVar114._28_4_ = (uint)!SUB81(uVar71 >> 7,0) * auVar93._28_4_;
                auVar29._8_4_ = 0x40000000;
                auVar29._0_8_ = 0x4000000040000000;
                auVar29._12_4_ = 0x40000000;
                auVar29._16_4_ = 0x40000000;
                auVar29._20_4_ = 0x40000000;
                auVar29._24_4_ = 0x40000000;
                auVar29._28_4_ = 0x40000000;
                local_3c0 = vfmsub132ps_avx512vl(auVar114,auVar91,auVar29);
                local_380 = 0;
                local_360 = local_650._0_8_;
                uStack_358 = local_650._8_8_;
                local_350 = local_660._0_8_;
                uStack_348 = local_660._8_8_;
                if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (uVar71 = CONCAT71((int7)((ulong)pGVar12 >> 8),1),
                     pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    fVar150 = 1.0 / auVar176._0_4_;
                    local_320[0] = fVar150 * (local_3e0._0_4_ + 0.0);
                    local_320[1] = fVar150 * (local_3e0._4_4_ + 1.0);
                    local_320[2] = fVar150 * (local_3e0._8_4_ + 2.0);
                    local_320[3] = fVar150 * (local_3e0._12_4_ + 3.0);
                    fStack_310 = fVar150 * (local_3e0._16_4_ + 4.0);
                    fStack_30c = fVar150 * (local_3e0._20_4_ + 5.0);
                    fStack_308 = fVar150 * (local_3e0._24_4_ + 6.0);
                    fStack_304 = local_3e0._28_4_ + 7.0;
                    local_300 = local_3c0;
                    local_2e0 = local_3a0;
                    uVar72 = 0;
                    local_480 = (ulong)((byte)uVar142 & bVar77);
                    for (uVar71 = local_480; (uVar71 & 1) == 0;
                        uVar71 = uVar71 >> 1 | 0x8000000000000000) {
                      uVar72 = uVar72 + 1;
                    }
                    local_4c0 = vpbroadcastd_avx512vl();
                    local_4e0 = vpbroadcastd_avx512vl();
                    uVar71 = uVar72;
                    local_520 = auVar179;
                    local_37c = iVar11;
                    local_370 = auVar22;
                    do {
                      auVar80 = auVar191._0_16_;
                      fVar150 = local_320[uVar72];
                      auVar143._4_4_ = fVar150;
                      auVar143._0_4_ = fVar150;
                      auVar143._8_4_ = fVar150;
                      auVar143._12_4_ = fVar150;
                      local_220._16_4_ = fVar150;
                      local_220._0_16_ = auVar143;
                      local_220._20_4_ = fVar150;
                      local_220._24_4_ = fVar150;
                      local_220._28_4_ = fVar150;
                      local_420 = (uint)uVar72;
                      uStack_41c = (undefined4)(uVar72 >> 0x20);
                      local_200 = *(undefined4 *)(local_300 + uVar72 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2e0 + uVar72 * 4)
                      ;
                      local_6b0.context = context->user;
                      fVar133 = 1.0 - fVar150;
                      auVar26._8_4_ = 0x80000000;
                      auVar26._0_8_ = 0x8000000080000000;
                      auVar26._12_4_ = 0x80000000;
                      auVar81 = vxorps_avx512vl(ZEXT416((uint)fVar133),auVar26);
                      auVar82 = ZEXT416((uint)(fVar150 * fVar133 * 4.0));
                      auVar84 = vfnmsub213ss_fma(auVar143,auVar143,auVar82);
                      auVar82 = vfmadd213ss_fma(ZEXT416((uint)fVar133),ZEXT416((uint)fVar133),
                                                auVar82);
                      fVar133 = fVar133 * auVar81._0_4_ * 0.5;
                      fVar140 = auVar84._0_4_ * 0.5;
                      fVar141 = auVar82._0_4_ * 0.5;
                      fVar150 = fVar150 * fVar150 * 0.5;
                      auVar163._0_4_ = fVar150 * (float)local_490._0_4_;
                      auVar163._4_4_ = fVar150 * (float)local_490._4_4_;
                      auVar163._8_4_ = fVar150 * fStack_488;
                      auVar163._12_4_ = fVar150 * fStack_484;
                      auVar135._4_4_ = fVar141;
                      auVar135._0_4_ = fVar141;
                      auVar135._8_4_ = fVar141;
                      auVar135._12_4_ = fVar141;
                      auVar82 = vfmadd132ps_fma(auVar135,auVar163,local_660);
                      auVar155._4_4_ = fVar140;
                      auVar155._0_4_ = fVar140;
                      auVar155._8_4_ = fVar140;
                      auVar155._12_4_ = fVar140;
                      auVar82 = vfmadd132ps_fma(auVar155,auVar82,local_650);
                      auVar136._4_4_ = fVar133;
                      auVar136._0_4_ = fVar133;
                      auVar136._8_4_ = fVar133;
                      auVar136._12_4_ = fVar133;
                      auVar82 = vfmadd213ps_fma(auVar136,auVar22,auVar82);
                      local_280 = auVar82._0_4_;
                      auVar159._8_4_ = 1;
                      auVar159._0_8_ = 0x100000001;
                      auVar159._12_4_ = 1;
                      auVar159._16_4_ = 1;
                      auVar159._20_4_ = 1;
                      auVar159._24_4_ = 1;
                      auVar159._28_4_ = 1;
                      local_260 = vpermps_avx2(auVar159,ZEXT1632(auVar82));
                      auVar165._8_4_ = 2;
                      auVar165._0_8_ = 0x200000002;
                      auVar165._12_4_ = 2;
                      auVar165._16_4_ = 2;
                      auVar165._20_4_ = 2;
                      auVar165._24_4_ = 2;
                      auVar165._28_4_ = 2;
                      local_240 = vpermps_avx2(auVar165,ZEXT1632(auVar82));
                      uStack_27c = local_280;
                      uStack_278 = local_280;
                      uStack_274 = local_280;
                      uStack_270 = local_280;
                      uStack_26c = local_280;
                      uStack_268 = local_280;
                      uStack_264 = local_280;
                      uStack_1fc = local_200;
                      uStack_1f8 = local_200;
                      uStack_1f4 = local_200;
                      uStack_1f0 = local_200;
                      uStack_1ec = local_200;
                      uStack_1e8 = local_200;
                      uStack_1e4 = local_200;
                      local_1e0 = local_4e0._0_8_;
                      uStack_1d8 = local_4e0._8_8_;
                      uStack_1d0 = local_4e0._16_8_;
                      uStack_1c8 = local_4e0._24_8_;
                      local_1c0 = local_4c0;
                      vpcmpeqd_avx2(local_4c0,local_4c0);
                      local_1a0 = (local_6b0.context)->instID[0];
                      uStack_19c = local_1a0;
                      uStack_198 = local_1a0;
                      uStack_194 = local_1a0;
                      uStack_190 = local_1a0;
                      uStack_18c = local_1a0;
                      uStack_188 = local_1a0;
                      uStack_184 = local_1a0;
                      local_180 = (local_6b0.context)->instPrimID[0];
                      uStack_17c = local_180;
                      uStack_178 = local_180;
                      uStack_174 = local_180;
                      uStack_170 = local_180;
                      uStack_16c = local_180;
                      uStack_168 = local_180;
                      uStack_164 = local_180;
                      local_5c0 = local_2a0;
                      local_6b0.valid = (int *)local_5c0;
                      local_6b0.geometryUserPtr = *(void **)(local_5a0._0_8_ + 0x18);
                      local_6b0.hit = (RTCHitN *)&local_280;
                      local_6b0.N = 8;
                      local_6b0.ray = (RTCRayN *)ray;
                      if (*(code **)(local_5a0._0_8_ + 0x48) != (code *)0x0) {
                        (**(code **)(local_5a0._0_8_ + 0x48))(&local_6b0);
                        auVar181 = ZEXT3264(local_520);
                        auVar195 = ZEXT3264(local_620);
                        auVar194 = ZEXT3264(local_600);
                        auVar192 = ZEXT3264(local_640);
                        auVar186 = ZEXT3264(local_680);
                        auVar187 = ZEXT3264(local_580);
                        auVar190 = ZEXT3264(local_560);
                        auVar189 = ZEXT3264(local_540);
                        auVar188 = ZEXT3264(local_500);
                        auVar82 = vxorps_avx512vl(auVar80,auVar80);
                        auVar191 = ZEXT1664(auVar82);
                      }
                      auVar82 = auVar191._0_16_;
                      if (local_5c0 == (undefined1  [32])0x0) {
                        auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar193 = ZEXT3264(auVar93);
                      }
                      else {
                        p_Var13 = context->args->filter;
                        if (p_Var13 == (RTCFilterFunctionN)0x0) {
                          auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar193 = ZEXT3264(auVar93);
                        }
                        else {
                          auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar193 = ZEXT3264(auVar93);
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             ((*(byte *)(local_5a0._0_8_ + 0x3e) & 0x40) != 0)) {
                            (*p_Var13)(&local_6b0);
                            auVar181 = ZEXT3264(local_520);
                            auVar195 = ZEXT3264(local_620);
                            auVar194 = ZEXT3264(local_600);
                            auVar192 = ZEXT3264(local_640);
                            auVar186 = ZEXT3264(local_680);
                            auVar187 = ZEXT3264(local_580);
                            auVar190 = ZEXT3264(local_560);
                            auVar189 = ZEXT3264(local_540);
                            auVar188 = ZEXT3264(local_500);
                            auVar82 = vxorps_avx512vl(auVar82,auVar82);
                            auVar191 = ZEXT1664(auVar82);
                            auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar193 = ZEXT3264(auVar93);
                          }
                        }
                        uVar72 = vptestmd_avx512vl(local_5c0,local_5c0);
                        auVar93 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar14 = (bool)((byte)uVar72 & 1);
                        bVar15 = (bool)((byte)(uVar72 >> 1) & 1);
                        bVar16 = (bool)((byte)(uVar72 >> 2) & 1);
                        bVar17 = (bool)((byte)(uVar72 >> 3) & 1);
                        bVar18 = (bool)((byte)(uVar72 >> 4) & 1);
                        bVar19 = (bool)((byte)(uVar72 >> 5) & 1);
                        bVar20 = (bool)((byte)(uVar72 >> 6) & 1);
                        bVar21 = SUB81(uVar72 >> 7,0);
                        *(uint *)(local_6b0.ray + 0x100) =
                             (uint)bVar14 * auVar93._0_4_ |
                             (uint)!bVar14 * *(int *)(local_6b0.ray + 0x100);
                        *(uint *)(local_6b0.ray + 0x104) =
                             (uint)bVar15 * auVar93._4_4_ |
                             (uint)!bVar15 * *(int *)(local_6b0.ray + 0x104);
                        *(uint *)(local_6b0.ray + 0x108) =
                             (uint)bVar16 * auVar93._8_4_ |
                             (uint)!bVar16 * *(int *)(local_6b0.ray + 0x108);
                        *(uint *)(local_6b0.ray + 0x10c) =
                             (uint)bVar17 * auVar93._12_4_ |
                             (uint)!bVar17 * *(int *)(local_6b0.ray + 0x10c);
                        *(uint *)(local_6b0.ray + 0x110) =
                             (uint)bVar18 * auVar93._16_4_ |
                             (uint)!bVar18 * *(int *)(local_6b0.ray + 0x110);
                        *(uint *)(local_6b0.ray + 0x114) =
                             (uint)bVar19 * auVar93._20_4_ |
                             (uint)!bVar19 * *(int *)(local_6b0.ray + 0x114);
                        *(uint *)(local_6b0.ray + 0x118) =
                             (uint)bVar20 * auVar93._24_4_ |
                             (uint)!bVar20 * *(int *)(local_6b0.ray + 0x118);
                        *(uint *)(local_6b0.ray + 0x11c) =
                             (uint)bVar21 * auVar93._28_4_ |
                             (uint)!bVar21 * *(int *)(local_6b0.ray + 0x11c);
                        if (local_5c0 != (undefined1  [32])0x0) {
                          uVar71 = CONCAT71((int7)(uVar71 >> 8),1);
                          break;
                        }
                      }
                      *(int *)(ray + k * 4 + 0x100) = auVar181._0_4_;
                      uVar71 = 0;
                      uVar72 = 0;
                      local_480 = local_480 ^ 1L << ((ulong)local_420 & 0x3f);
                      for (uVar75 = local_480; (uVar75 & 1) == 0;
                          uVar75 = uVar75 >> 1 | 0x8000000000000000) {
                        uVar72 = uVar72 + 1;
                      }
                    } while (local_480 != 0);
                  }
                  goto LAB_01cbf833;
                }
              }
            }
            uVar71 = 0;
          }
        }
      }
LAB_01cbf833:
      if (8 < iVar11) {
        local_5a0 = vpbroadcastd_avx512vl();
        fStack_3fc = local_400;
        fStack_3f8 = local_400;
        fStack_3f4 = local_400;
        fStack_3f0 = local_400;
        fStack_3ec = local_400;
        fStack_3e8 = local_400;
        fStack_3e4 = local_400;
        fStack_478 = 1.0 / (float)local_460._0_4_;
        local_460 = vpbroadcastd_avx512vl();
        local_440 = vpbroadcastd_avx512vl();
        lVar76 = 8;
        fStack_474 = fStack_478;
        fStack_470 = fStack_478;
        fStack_46c = fStack_478;
        fStack_468 = fStack_478;
        fStack_464 = fStack_478;
        local_420 = uVar134;
        uStack_41c = uVar134;
        uStack_418 = uVar134;
        uStack_414 = uVar134;
        uStack_410 = uVar134;
        uStack_40c = uVar134;
        uStack_408 = uVar134;
        uStack_404 = uVar134;
        local_480._0_4_ = fStack_478;
        local_480._4_4_ = fStack_478;
        do {
          auVar93 = vpbroadcastd_avx512vl();
          auVar95 = vpor_avx2(auVar93,_DAT_01fe9900);
          uVar23 = vpcmpd_avx512vl(auVar95,local_5a0,1);
          auVar93 = *(undefined1 (*) [32])(bspline_basis0 + lVar76 * 4 + lVar24);
          auVar90 = *(undefined1 (*) [32])(lVar24 + 0x21aefac + lVar76 * 4);
          auVar91 = *(undefined1 (*) [32])(lVar24 + 0x21af430 + lVar76 * 4);
          auVar92 = *(undefined1 (*) [32])(lVar24 + 0x21af8b4 + lVar76 * 4);
          local_600 = auVar194._0_32_;
          auVar94 = vmulps_avx512vl(local_600,auVar92);
          local_620 = auVar195._0_32_;
          auVar103 = vmulps_avx512vl(local_620,auVar92);
          auVar49._4_4_ = auVar92._4_4_ * (float)local_100._4_4_;
          auVar49._0_4_ = auVar92._0_4_ * (float)local_100._0_4_;
          auVar49._8_4_ = auVar92._8_4_ * fStack_f8;
          auVar49._12_4_ = auVar92._12_4_ * fStack_f4;
          auVar49._16_4_ = auVar92._16_4_ * fStack_f0;
          auVar49._20_4_ = auVar92._20_4_ * fStack_ec;
          auVar49._24_4_ = auVar92._24_4_ * fStack_e8;
          auVar49._28_4_ = auVar95._28_4_;
          auVar145 = auVar186._0_32_;
          auVar95 = vfmadd231ps_avx512vl(auVar94,auVar91,auVar145);
          local_640 = auVar192._0_32_;
          auVar94 = vfmadd231ps_avx512vl(auVar103,auVar91,local_640);
          auVar103 = vfmadd231ps_avx512vl(auVar49,auVar91,local_e0);
          auVar170 = auVar190._0_32_;
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar90,auVar170);
          auVar147 = auVar187._0_32_;
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar90,auVar147);
          auVar82 = vfmadd231ps_fma(auVar103,auVar90,local_c0);
          local_500 = auVar188._0_32_;
          auVar89 = vfmadd231ps_avx512vl(auVar95,auVar93,local_500);
          auVar168 = auVar189._0_32_;
          auVar98 = vfmadd231ps_avx512vl(auVar94,auVar93,auVar168);
          auVar95 = *(undefined1 (*) [32])(bspline_basis1 + lVar76 * 4 + lVar24);
          auVar94 = *(undefined1 (*) [32])(lVar24 + 0x21b13cc + lVar76 * 4);
          auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar93,local_a0);
          auVar103 = *(undefined1 (*) [32])(lVar24 + 0x21b1850 + lVar76 * 4);
          auVar102 = *(undefined1 (*) [32])(lVar24 + 0x21b1cd4 + lVar76 * 4);
          auVar96 = vmulps_avx512vl(local_600,auVar102);
          auVar97 = vmulps_avx512vl(local_620,auVar102);
          auVar50._4_4_ = auVar102._4_4_ * (float)local_100._4_4_;
          auVar50._0_4_ = auVar102._0_4_ * (float)local_100._0_4_;
          auVar50._8_4_ = auVar102._8_4_ * fStack_f8;
          auVar50._12_4_ = auVar102._12_4_ * fStack_f4;
          auVar50._16_4_ = auVar102._16_4_ * fStack_f0;
          auVar50._20_4_ = auVar102._20_4_ * fStack_ec;
          auVar50._24_4_ = auVar102._24_4_ * fStack_e8;
          auVar50._28_4_ = uStack_e4;
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar103,auVar145);
          auVar97 = vfmadd231ps_avx512vl(auVar97,auVar103,local_640);
          auVar99 = vfmadd231ps_avx512vl(auVar50,auVar103,local_e0);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar94,auVar170);
          auVar97 = vfmadd231ps_avx512vl(auVar97,auVar94,auVar147);
          auVar84 = vfmadd231ps_fma(auVar99,auVar94,local_c0);
          auVar99 = vfmadd231ps_avx512vl(auVar96,auVar95,local_500);
          auVar87 = vfmadd231ps_avx512vl(auVar97,auVar95,auVar168);
          auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar95,local_a0);
          auVar88 = vmaxps_avx512vl(ZEXT1632(auVar82),ZEXT1632(auVar84));
          auVar96 = vsubps_avx(auVar99,auVar89);
          auVar97 = vsubps_avx(auVar87,auVar98);
          auVar100 = vmulps_avx512vl(auVar98,auVar96);
          auVar101 = vmulps_avx512vl(auVar89,auVar97);
          auVar100 = vsubps_avx512vl(auVar100,auVar101);
          auVar101 = vmulps_avx512vl(auVar97,auVar97);
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar96,auVar96);
          auVar88 = vmulps_avx512vl(auVar88,auVar88);
          auVar88 = vmulps_avx512vl(auVar88,auVar101);
          auVar100 = vmulps_avx512vl(auVar100,auVar100);
          uVar142 = vcmpps_avx512vl(auVar100,auVar88,2);
          bVar77 = (byte)uVar23 & (byte)uVar142;
          if (bVar77 == 0) {
            auVar181 = ZEXT3264(auVar147);
            auVar186 = ZEXT3264(auVar145);
          }
          else {
            auVar102 = vmulps_avx512vl(local_5e0,auVar102);
            auVar103 = vfmadd213ps_avx512vl(auVar103,local_160,auVar102);
            auVar94 = vfmadd213ps_avx512vl(auVar94,local_140,auVar103);
            auVar95 = vfmadd213ps_avx512vl(auVar95,local_120,auVar94);
            auVar92 = vmulps_avx512vl(local_5e0,auVar92);
            auVar91 = vfmadd213ps_avx512vl(auVar91,local_160,auVar92);
            auVar90 = vfmadd213ps_avx512vl(auVar90,local_140,auVar91);
            auVar94 = vfmadd213ps_avx512vl(auVar93,local_120,auVar90);
            auVar93 = *(undefined1 (*) [32])(lVar24 + 0x21afd38 + lVar76 * 4);
            auVar90 = *(undefined1 (*) [32])(lVar24 + 0x21b01bc + lVar76 * 4);
            auVar91 = *(undefined1 (*) [32])(lVar24 + 0x21b0640 + lVar76 * 4);
            auVar92 = *(undefined1 (*) [32])(lVar24 + 0x21b0ac4 + lVar76 * 4);
            auVar103 = vmulps_avx512vl(local_600,auVar92);
            auVar102 = vmulps_avx512vl(local_620,auVar92);
            auVar92 = vmulps_avx512vl(local_5e0,auVar92);
            auVar103 = vfmadd231ps_avx512vl(auVar103,auVar91,auVar145);
            auVar102 = vfmadd231ps_avx512vl(auVar102,auVar91,local_640);
            auVar91 = vfmadd231ps_avx512vl(auVar92,local_160,auVar91);
            auVar92 = vfmadd231ps_avx512vl(auVar103,auVar90,auVar170);
            auVar103 = vfmadd231ps_avx512vl(auVar102,auVar90,auVar147);
            auVar90 = vfmadd231ps_avx512vl(auVar91,local_140,auVar90);
            auVar92 = vfmadd231ps_avx512vl(auVar92,auVar93,local_500);
            auVar103 = vfmadd231ps_avx512vl(auVar103,auVar93,auVar168);
            auVar102 = vfmadd231ps_avx512vl(auVar90,local_120,auVar93);
            auVar93 = *(undefined1 (*) [32])(lVar24 + 0x21b2158 + lVar76 * 4);
            auVar90 = *(undefined1 (*) [32])(lVar24 + 0x21b2a60 + lVar76 * 4);
            auVar91 = *(undefined1 (*) [32])(lVar24 + 0x21b2ee4 + lVar76 * 4);
            auVar88 = vmulps_avx512vl(local_600,auVar91);
            auVar100 = vmulps_avx512vl(local_620,auVar91);
            auVar91 = vmulps_avx512vl(local_5e0,auVar91);
            auVar88 = vfmadd231ps_avx512vl(auVar88,auVar90,auVar145);
            auVar100 = vfmadd231ps_avx512vl(auVar100,auVar90,local_640);
            auVar91 = vfmadd231ps_avx512vl(auVar91,local_160,auVar90);
            auVar90 = *(undefined1 (*) [32])(lVar24 + 0x21b25dc + lVar76 * 4);
            auVar88 = vfmadd231ps_avx512vl(auVar88,auVar90,auVar170);
            auVar100 = vfmadd231ps_avx512vl(auVar100,auVar90,auVar147);
            auVar90 = vfmadd231ps_avx512vl(auVar91,local_140,auVar90);
            auVar91 = vfmadd231ps_avx512vl(auVar88,auVar93,local_500);
            auVar88 = vfmadd231ps_avx512vl(auVar100,auVar93,auVar168);
            auVar90 = vfmadd231ps_avx512vl(auVar90,local_120,auVar93);
            auVar100 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar92,auVar100);
            vandps_avx512vl(auVar103,auVar100);
            auVar93 = vmaxps_avx(auVar100,auVar100);
            vandps_avx512vl(auVar102,auVar100);
            auVar93 = vmaxps_avx(auVar93,auVar100);
            auVar69._4_4_ = fStack_3fc;
            auVar69._0_4_ = local_400;
            auVar69._8_4_ = fStack_3f8;
            auVar69._12_4_ = fStack_3f4;
            auVar69._16_4_ = fStack_3f0;
            auVar69._20_4_ = fStack_3ec;
            auVar69._24_4_ = fStack_3e8;
            auVar69._28_4_ = fStack_3e4;
            uVar72 = vcmpps_avx512vl(auVar93,auVar69,1);
            bVar14 = (bool)((byte)uVar72 & 1);
            auVar115._0_4_ = (float)((uint)bVar14 * auVar96._0_4_ | (uint)!bVar14 * auVar92._0_4_);
            bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
            auVar115._4_4_ = (float)((uint)bVar14 * auVar96._4_4_ | (uint)!bVar14 * auVar92._4_4_);
            bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
            auVar115._8_4_ = (float)((uint)bVar14 * auVar96._8_4_ | (uint)!bVar14 * auVar92._8_4_);
            bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
            auVar115._12_4_ =
                 (float)((uint)bVar14 * auVar96._12_4_ | (uint)!bVar14 * auVar92._12_4_);
            bVar14 = (bool)((byte)(uVar72 >> 4) & 1);
            auVar115._16_4_ =
                 (float)((uint)bVar14 * auVar96._16_4_ | (uint)!bVar14 * auVar92._16_4_);
            bVar14 = (bool)((byte)(uVar72 >> 5) & 1);
            auVar115._20_4_ =
                 (float)((uint)bVar14 * auVar96._20_4_ | (uint)!bVar14 * auVar92._20_4_);
            bVar14 = (bool)((byte)(uVar72 >> 6) & 1);
            auVar115._24_4_ =
                 (float)((uint)bVar14 * auVar96._24_4_ | (uint)!bVar14 * auVar92._24_4_);
            bVar14 = SUB81(uVar72 >> 7,0);
            auVar115._28_4_ = (uint)bVar14 * auVar96._28_4_ | (uint)!bVar14 * auVar92._28_4_;
            bVar14 = (bool)((byte)uVar72 & 1);
            auVar116._0_4_ = (float)((uint)bVar14 * auVar97._0_4_ | (uint)!bVar14 * auVar103._0_4_);
            bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
            auVar116._4_4_ = (float)((uint)bVar14 * auVar97._4_4_ | (uint)!bVar14 * auVar103._4_4_);
            bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
            auVar116._8_4_ = (float)((uint)bVar14 * auVar97._8_4_ | (uint)!bVar14 * auVar103._8_4_);
            bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
            auVar116._12_4_ =
                 (float)((uint)bVar14 * auVar97._12_4_ | (uint)!bVar14 * auVar103._12_4_);
            bVar14 = (bool)((byte)(uVar72 >> 4) & 1);
            auVar116._16_4_ =
                 (float)((uint)bVar14 * auVar97._16_4_ | (uint)!bVar14 * auVar103._16_4_);
            bVar14 = (bool)((byte)(uVar72 >> 5) & 1);
            auVar116._20_4_ =
                 (float)((uint)bVar14 * auVar97._20_4_ | (uint)!bVar14 * auVar103._20_4_);
            bVar14 = (bool)((byte)(uVar72 >> 6) & 1);
            auVar116._24_4_ =
                 (float)((uint)bVar14 * auVar97._24_4_ | (uint)!bVar14 * auVar103._24_4_);
            bVar14 = SUB81(uVar72 >> 7,0);
            auVar116._28_4_ = (uint)bVar14 * auVar97._28_4_ | (uint)!bVar14 * auVar103._28_4_;
            vandps_avx512vl(auVar91,auVar100);
            vandps_avx512vl(auVar88,auVar100);
            auVar93 = vmaxps_avx(auVar116,auVar116);
            vandps_avx512vl(auVar90,auVar100);
            auVar93 = vmaxps_avx(auVar93,auVar116);
            uVar72 = vcmpps_avx512vl(auVar93,auVar69,1);
            bVar14 = (bool)((byte)uVar72 & 1);
            auVar117._0_4_ = (uint)bVar14 * auVar96._0_4_ | (uint)!bVar14 * auVar91._0_4_;
            bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
            auVar117._4_4_ = (uint)bVar14 * auVar96._4_4_ | (uint)!bVar14 * auVar91._4_4_;
            bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
            auVar117._8_4_ = (uint)bVar14 * auVar96._8_4_ | (uint)!bVar14 * auVar91._8_4_;
            bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
            auVar117._12_4_ = (uint)bVar14 * auVar96._12_4_ | (uint)!bVar14 * auVar91._12_4_;
            bVar14 = (bool)((byte)(uVar72 >> 4) & 1);
            auVar117._16_4_ = (uint)bVar14 * auVar96._16_4_ | (uint)!bVar14 * auVar91._16_4_;
            bVar14 = (bool)((byte)(uVar72 >> 5) & 1);
            auVar117._20_4_ = (uint)bVar14 * auVar96._20_4_ | (uint)!bVar14 * auVar91._20_4_;
            bVar14 = (bool)((byte)(uVar72 >> 6) & 1);
            auVar117._24_4_ = (uint)bVar14 * auVar96._24_4_ | (uint)!bVar14 * auVar91._24_4_;
            bVar14 = SUB81(uVar72 >> 7,0);
            auVar117._28_4_ = (uint)bVar14 * auVar96._28_4_ | (uint)!bVar14 * auVar91._28_4_;
            bVar14 = (bool)((byte)uVar72 & 1);
            auVar118._0_4_ = (float)((uint)bVar14 * auVar97._0_4_ | (uint)!bVar14 * auVar88._0_4_);
            bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
            auVar118._4_4_ = (float)((uint)bVar14 * auVar97._4_4_ | (uint)!bVar14 * auVar88._4_4_);
            bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
            auVar118._8_4_ = (float)((uint)bVar14 * auVar97._8_4_ | (uint)!bVar14 * auVar88._8_4_);
            bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
            auVar118._12_4_ =
                 (float)((uint)bVar14 * auVar97._12_4_ | (uint)!bVar14 * auVar88._12_4_);
            bVar14 = (bool)((byte)(uVar72 >> 4) & 1);
            auVar118._16_4_ =
                 (float)((uint)bVar14 * auVar97._16_4_ | (uint)!bVar14 * auVar88._16_4_);
            bVar14 = (bool)((byte)(uVar72 >> 5) & 1);
            auVar118._20_4_ =
                 (float)((uint)bVar14 * auVar97._20_4_ | (uint)!bVar14 * auVar88._20_4_);
            bVar14 = (bool)((byte)(uVar72 >> 6) & 1);
            auVar118._24_4_ =
                 (float)((uint)bVar14 * auVar97._24_4_ | (uint)!bVar14 * auVar88._24_4_);
            bVar14 = SUB81(uVar72 >> 7,0);
            auVar118._28_4_ = (uint)bVar14 * auVar97._28_4_ | (uint)!bVar14 * auVar88._28_4_;
            auVar173._8_4_ = 0x80000000;
            auVar173._0_8_ = 0x8000000080000000;
            auVar173._12_4_ = 0x80000000;
            auVar173._16_4_ = 0x80000000;
            auVar173._20_4_ = 0x80000000;
            auVar173._24_4_ = 0x80000000;
            auVar173._28_4_ = 0x80000000;
            auVar93 = vxorps_avx512vl(auVar117,auVar173);
            auVar88 = auVar191._0_32_;
            auVar90 = vfmadd213ps_avx512vl(auVar115,auVar115,auVar88);
            auVar81 = vfmadd231ps_fma(auVar90,auVar116,auVar116);
            auVar90 = vrsqrt14ps_avx512vl(ZEXT1632(auVar81));
            auVar185._8_4_ = 0xbf000000;
            auVar185._0_8_ = 0xbf000000bf000000;
            auVar185._12_4_ = 0xbf000000;
            auVar185._16_4_ = 0xbf000000;
            auVar185._20_4_ = 0xbf000000;
            auVar185._24_4_ = 0xbf000000;
            auVar185._28_4_ = 0xbf000000;
            fVar150 = auVar90._0_4_;
            fVar133 = auVar90._4_4_;
            fVar140 = auVar90._8_4_;
            fVar141 = auVar90._12_4_;
            fVar167 = auVar90._16_4_;
            fVar169 = auVar90._20_4_;
            fVar78 = auVar90._24_4_;
            auVar51._4_4_ = fVar133 * fVar133 * fVar133 * auVar81._4_4_ * -0.5;
            auVar51._0_4_ = fVar150 * fVar150 * fVar150 * auVar81._0_4_ * -0.5;
            auVar51._8_4_ = fVar140 * fVar140 * fVar140 * auVar81._8_4_ * -0.5;
            auVar51._12_4_ = fVar141 * fVar141 * fVar141 * auVar81._12_4_ * -0.5;
            auVar51._16_4_ = fVar167 * fVar167 * fVar167 * -0.0;
            auVar51._20_4_ = fVar169 * fVar169 * fVar169 * -0.0;
            auVar51._24_4_ = fVar78 * fVar78 * fVar78 * -0.0;
            auVar51._28_4_ = auVar116._28_4_;
            auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar90 = vfmadd231ps_avx512vl(auVar51,auVar91,auVar90);
            auVar52._4_4_ = auVar116._4_4_ * auVar90._4_4_;
            auVar52._0_4_ = auVar116._0_4_ * auVar90._0_4_;
            auVar52._8_4_ = auVar116._8_4_ * auVar90._8_4_;
            auVar52._12_4_ = auVar116._12_4_ * auVar90._12_4_;
            auVar52._16_4_ = auVar116._16_4_ * auVar90._16_4_;
            auVar52._20_4_ = auVar116._20_4_ * auVar90._20_4_;
            auVar52._24_4_ = auVar116._24_4_ * auVar90._24_4_;
            auVar52._28_4_ = 0;
            auVar53._4_4_ = auVar90._4_4_ * -auVar115._4_4_;
            auVar53._0_4_ = auVar90._0_4_ * -auVar115._0_4_;
            auVar53._8_4_ = auVar90._8_4_ * -auVar115._8_4_;
            auVar53._12_4_ = auVar90._12_4_ * -auVar115._12_4_;
            auVar53._16_4_ = auVar90._16_4_ * -auVar115._16_4_;
            auVar53._20_4_ = auVar90._20_4_ * -auVar115._20_4_;
            auVar53._24_4_ = auVar90._24_4_ * -auVar115._24_4_;
            auVar53._28_4_ = auVar116._28_4_;
            auVar92 = vmulps_avx512vl(auVar90,auVar88);
            auVar90 = vfmadd213ps_avx512vl(auVar117,auVar117,auVar88);
            auVar90 = vfmadd231ps_avx512vl(auVar90,auVar118,auVar118);
            auVar103 = vrsqrt14ps_avx512vl(auVar90);
            auVar90 = vmulps_avx512vl(auVar90,auVar185);
            fVar150 = auVar103._0_4_;
            fVar133 = auVar103._4_4_;
            fVar140 = auVar103._8_4_;
            fVar141 = auVar103._12_4_;
            fVar167 = auVar103._16_4_;
            fVar169 = auVar103._20_4_;
            fVar78 = auVar103._24_4_;
            auVar54._4_4_ = fVar133 * fVar133 * fVar133 * auVar90._4_4_;
            auVar54._0_4_ = fVar150 * fVar150 * fVar150 * auVar90._0_4_;
            auVar54._8_4_ = fVar140 * fVar140 * fVar140 * auVar90._8_4_;
            auVar54._12_4_ = fVar141 * fVar141 * fVar141 * auVar90._12_4_;
            auVar54._16_4_ = fVar167 * fVar167 * fVar167 * auVar90._16_4_;
            auVar54._20_4_ = fVar169 * fVar169 * fVar169 * auVar90._20_4_;
            auVar54._24_4_ = fVar78 * fVar78 * fVar78 * auVar90._24_4_;
            auVar54._28_4_ = auVar90._28_4_;
            auVar90 = vfmadd231ps_avx512vl(auVar54,auVar91,auVar103);
            auVar55._4_4_ = auVar118._4_4_ * auVar90._4_4_;
            auVar55._0_4_ = auVar118._0_4_ * auVar90._0_4_;
            auVar55._8_4_ = auVar118._8_4_ * auVar90._8_4_;
            auVar55._12_4_ = auVar118._12_4_ * auVar90._12_4_;
            auVar55._16_4_ = auVar118._16_4_ * auVar90._16_4_;
            auVar55._20_4_ = auVar118._20_4_ * auVar90._20_4_;
            auVar55._24_4_ = auVar118._24_4_ * auVar90._24_4_;
            auVar55._28_4_ = auVar103._28_4_;
            auVar56._4_4_ = auVar90._4_4_ * auVar93._4_4_;
            auVar56._0_4_ = auVar90._0_4_ * auVar93._0_4_;
            auVar56._8_4_ = auVar90._8_4_ * auVar93._8_4_;
            auVar56._12_4_ = auVar90._12_4_ * auVar93._12_4_;
            auVar56._16_4_ = auVar90._16_4_ * auVar93._16_4_;
            auVar56._20_4_ = auVar90._20_4_ * auVar93._20_4_;
            auVar56._24_4_ = auVar90._24_4_ * auVar93._24_4_;
            auVar56._28_4_ = auVar93._28_4_;
            auVar93 = vmulps_avx512vl(auVar90,auVar88);
            auVar81 = vfmadd213ps_fma(auVar52,ZEXT1632(auVar82),auVar89);
            auVar90 = ZEXT1632(auVar82);
            auVar80 = vfmadd213ps_fma(auVar53,auVar90,auVar98);
            auVar91 = vfmadd213ps_avx512vl(auVar92,auVar90,auVar94);
            auVar103 = vfmadd213ps_avx512vl(auVar55,ZEXT1632(auVar84),auVar99);
            auVar83 = vfnmadd213ps_fma(auVar52,auVar90,auVar89);
            auVar102 = ZEXT1632(auVar84);
            auVar6 = vfmadd213ps_fma(auVar56,auVar102,auVar87);
            auVar85 = vfnmadd213ps_fma(auVar53,auVar90,auVar98);
            auVar7 = vfmadd213ps_fma(auVar93,auVar102,auVar95);
            auVar98 = ZEXT1632(auVar82);
            auVar86 = vfnmadd231ps_fma(auVar94,auVar98,auVar92);
            auVar151 = vfnmadd213ps_fma(auVar55,auVar102,auVar99);
            auVar152 = vfnmadd213ps_fma(auVar56,auVar102,auVar87);
            auVar172 = vfnmadd231ps_fma(auVar95,ZEXT1632(auVar84),auVar93);
            auVar95 = vsubps_avx512vl(auVar103,ZEXT1632(auVar83));
            auVar93 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar85));
            auVar90 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar86));
            auVar57._4_4_ = auVar93._4_4_ * auVar86._4_4_;
            auVar57._0_4_ = auVar93._0_4_ * auVar86._0_4_;
            auVar57._8_4_ = auVar93._8_4_ * auVar86._8_4_;
            auVar57._12_4_ = auVar93._12_4_ * auVar86._12_4_;
            auVar57._16_4_ = auVar93._16_4_ * 0.0;
            auVar57._20_4_ = auVar93._20_4_ * 0.0;
            auVar57._24_4_ = auVar93._24_4_ * 0.0;
            auVar57._28_4_ = auVar92._28_4_;
            auVar82 = vfmsub231ps_fma(auVar57,ZEXT1632(auVar85),auVar90);
            auVar58._4_4_ = auVar90._4_4_ * auVar83._4_4_;
            auVar58._0_4_ = auVar90._0_4_ * auVar83._0_4_;
            auVar58._8_4_ = auVar90._8_4_ * auVar83._8_4_;
            auVar58._12_4_ = auVar90._12_4_ * auVar83._12_4_;
            auVar58._16_4_ = auVar90._16_4_ * 0.0;
            auVar58._20_4_ = auVar90._20_4_ * 0.0;
            auVar58._24_4_ = auVar90._24_4_ * 0.0;
            auVar58._28_4_ = auVar90._28_4_;
            auVar8 = vfmsub231ps_fma(auVar58,ZEXT1632(auVar86),auVar95);
            auVar59._4_4_ = auVar85._4_4_ * auVar95._4_4_;
            auVar59._0_4_ = auVar85._0_4_ * auVar95._0_4_;
            auVar59._8_4_ = auVar85._8_4_ * auVar95._8_4_;
            auVar59._12_4_ = auVar85._12_4_ * auVar95._12_4_;
            auVar59._16_4_ = auVar95._16_4_ * 0.0;
            auVar59._20_4_ = auVar95._20_4_ * 0.0;
            auVar59._24_4_ = auVar95._24_4_ * 0.0;
            auVar59._28_4_ = auVar95._28_4_;
            auVar9 = vfmsub231ps_fma(auVar59,ZEXT1632(auVar83),auVar93);
            auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar9),auVar88,ZEXT1632(auVar8));
            auVar93 = vfmadd231ps_avx512vl(auVar93,auVar88,ZEXT1632(auVar82));
            uVar72 = vcmpps_avx512vl(auVar93,auVar88,2);
            bVar70 = (byte)uVar72;
            fVar125 = (float)((uint)(bVar70 & 1) * auVar81._0_4_ |
                             (uint)!(bool)(bVar70 & 1) * auVar151._0_4_);
            bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
            fVar127 = (float)((uint)bVar14 * auVar81._4_4_ | (uint)!bVar14 * auVar151._4_4_);
            bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
            fVar130 = (float)((uint)bVar14 * auVar81._8_4_ | (uint)!bVar14 * auVar151._8_4_);
            bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
            fVar131 = (float)((uint)bVar14 * auVar81._12_4_ | (uint)!bVar14 * auVar151._12_4_);
            auVar102 = ZEXT1632(CONCAT412(fVar131,CONCAT48(fVar130,CONCAT44(fVar127,fVar125))));
            fVar126 = (float)((uint)(bVar70 & 1) * auVar80._0_4_ |
                             (uint)!(bool)(bVar70 & 1) * auVar152._0_4_);
            bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
            fVar129 = (float)((uint)bVar14 * auVar80._4_4_ | (uint)!bVar14 * auVar152._4_4_);
            bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
            fVar128 = (float)((uint)bVar14 * auVar80._8_4_ | (uint)!bVar14 * auVar152._8_4_);
            bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
            fVar132 = (float)((uint)bVar14 * auVar80._12_4_ | (uint)!bVar14 * auVar152._12_4_);
            auVar96 = ZEXT1632(CONCAT412(fVar132,CONCAT48(fVar128,CONCAT44(fVar129,fVar126))));
            auVar119._0_4_ =
                 (float)((uint)(bVar70 & 1) * auVar91._0_4_ |
                        (uint)!(bool)(bVar70 & 1) * auVar172._0_4_);
            bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
            auVar119._4_4_ = (float)((uint)bVar14 * auVar91._4_4_ | (uint)!bVar14 * auVar172._4_4_);
            bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
            auVar119._8_4_ = (float)((uint)bVar14 * auVar91._8_4_ | (uint)!bVar14 * auVar172._8_4_);
            bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
            auVar119._12_4_ =
                 (float)((uint)bVar14 * auVar91._12_4_ | (uint)!bVar14 * auVar172._12_4_);
            fVar150 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar91._16_4_);
            auVar119._16_4_ = fVar150;
            fVar140 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar91._20_4_);
            auVar119._20_4_ = fVar140;
            fVar133 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar91._24_4_);
            auVar119._24_4_ = fVar133;
            iVar1 = (uint)(byte)(uVar72 >> 7) * auVar91._28_4_;
            auVar119._28_4_ = iVar1;
            auVar93 = vblendmps_avx512vl(ZEXT1632(auVar83),auVar103);
            auVar120._0_4_ =
                 (uint)(bVar70 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar82._0_4_;
            bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
            auVar120._4_4_ = (uint)bVar14 * auVar93._4_4_ | (uint)!bVar14 * auVar82._4_4_;
            bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
            auVar120._8_4_ = (uint)bVar14 * auVar93._8_4_ | (uint)!bVar14 * auVar82._8_4_;
            bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
            auVar120._12_4_ = (uint)bVar14 * auVar93._12_4_ | (uint)!bVar14 * auVar82._12_4_;
            auVar120._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * auVar93._16_4_;
            auVar120._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * auVar93._20_4_;
            auVar120._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * auVar93._24_4_;
            auVar120._28_4_ = (uint)(byte)(uVar72 >> 7) * auVar93._28_4_;
            auVar93 = vblendmps_avx512vl(ZEXT1632(auVar85),ZEXT1632(auVar6));
            auVar121._0_4_ =
                 (float)((uint)(bVar70 & 1) * auVar93._0_4_ |
                        (uint)!(bool)(bVar70 & 1) * auVar81._0_4_);
            bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
            auVar121._4_4_ = (float)((uint)bVar14 * auVar93._4_4_ | (uint)!bVar14 * auVar81._4_4_);
            bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
            auVar121._8_4_ = (float)((uint)bVar14 * auVar93._8_4_ | (uint)!bVar14 * auVar81._8_4_);
            bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
            auVar121._12_4_ =
                 (float)((uint)bVar14 * auVar93._12_4_ | (uint)!bVar14 * auVar81._12_4_);
            fVar141 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar93._16_4_);
            auVar121._16_4_ = fVar141;
            fVar167 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar93._20_4_);
            auVar121._20_4_ = fVar167;
            fVar169 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar93._24_4_);
            auVar121._24_4_ = fVar169;
            auVar121._28_4_ = (uint)(byte)(uVar72 >> 7) * auVar93._28_4_;
            auVar93 = vblendmps_avx512vl(ZEXT1632(auVar86),ZEXT1632(auVar7));
            auVar122._0_4_ =
                 (float)((uint)(bVar70 & 1) * auVar93._0_4_ |
                        (uint)!(bool)(bVar70 & 1) * auVar80._0_4_);
            bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
            auVar122._4_4_ = (float)((uint)bVar14 * auVar93._4_4_ | (uint)!bVar14 * auVar80._4_4_);
            bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
            auVar122._8_4_ = (float)((uint)bVar14 * auVar93._8_4_ | (uint)!bVar14 * auVar80._8_4_);
            bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
            auVar122._12_4_ =
                 (float)((uint)bVar14 * auVar93._12_4_ | (uint)!bVar14 * auVar80._12_4_);
            fVar79 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar93._16_4_);
            auVar122._16_4_ = fVar79;
            fVar149 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar93._20_4_);
            auVar122._20_4_ = fVar149;
            fVar78 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar93._24_4_);
            auVar122._24_4_ = fVar78;
            iVar2 = (uint)(byte)(uVar72 >> 7) * auVar93._28_4_;
            auVar122._28_4_ = iVar2;
            auVar123._0_4_ =
                 (uint)(bVar70 & 1) * (int)auVar83._0_4_ |
                 (uint)!(bool)(bVar70 & 1) * auVar103._0_4_;
            bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
            auVar123._4_4_ = (uint)bVar14 * (int)auVar83._4_4_ | (uint)!bVar14 * auVar103._4_4_;
            bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
            auVar123._8_4_ = (uint)bVar14 * (int)auVar83._8_4_ | (uint)!bVar14 * auVar103._8_4_;
            bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
            auVar123._12_4_ = (uint)bVar14 * (int)auVar83._12_4_ | (uint)!bVar14 * auVar103._12_4_;
            auVar123._16_4_ = (uint)!(bool)((byte)(uVar72 >> 4) & 1) * auVar103._16_4_;
            auVar123._20_4_ = (uint)!(bool)((byte)(uVar72 >> 5) & 1) * auVar103._20_4_;
            auVar123._24_4_ = (uint)!(bool)((byte)(uVar72 >> 6) & 1) * auVar103._24_4_;
            auVar123._28_4_ = (uint)!SUB81(uVar72 >> 7,0) * auVar103._28_4_;
            bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
            bVar16 = (bool)((byte)(uVar72 >> 2) & 1);
            bVar18 = (bool)((byte)(uVar72 >> 3) & 1);
            bVar15 = (bool)((byte)(uVar72 >> 1) & 1);
            bVar17 = (bool)((byte)(uVar72 >> 2) & 1);
            bVar19 = (bool)((byte)(uVar72 >> 3) & 1);
            auVar103 = vsubps_avx512vl(auVar123,auVar102);
            auVar90 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar85._12_4_ |
                                                    (uint)!bVar18 * auVar6._12_4_,
                                                    CONCAT48((uint)bVar16 * (int)auVar85._8_4_ |
                                                             (uint)!bVar16 * auVar6._8_4_,
                                                             CONCAT44((uint)bVar14 *
                                                                      (int)auVar85._4_4_ |
                                                                      (uint)!bVar14 * auVar6._4_4_,
                                                                      (uint)(bVar70 & 1) *
                                                                      (int)auVar85._0_4_ |
                                                                      (uint)!(bool)(bVar70 & 1) *
                                                                      auVar6._0_4_)))),auVar96);
            auVar91 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar86._12_4_ |
                                                    (uint)!bVar19 * auVar7._12_4_,
                                                    CONCAT48((uint)bVar17 * (int)auVar86._8_4_ |
                                                             (uint)!bVar17 * auVar7._8_4_,
                                                             CONCAT44((uint)bVar15 *
                                                                      (int)auVar86._4_4_ |
                                                                      (uint)!bVar15 * auVar7._4_4_,
                                                                      (uint)(bVar70 & 1) *
                                                                      (int)auVar86._0_4_ |
                                                                      (uint)!(bool)(bVar70 & 1) *
                                                                      auVar7._0_4_)))),auVar119);
            auVar92 = vsubps_avx(auVar102,auVar120);
            auVar95 = vsubps_avx(auVar96,auVar121);
            auVar94 = vsubps_avx(auVar119,auVar122);
            auVar60._4_4_ = auVar91._4_4_ * fVar127;
            auVar60._0_4_ = auVar91._0_4_ * fVar125;
            auVar60._8_4_ = auVar91._8_4_ * fVar130;
            auVar60._12_4_ = auVar91._12_4_ * fVar131;
            auVar60._16_4_ = auVar91._16_4_ * 0.0;
            auVar60._20_4_ = auVar91._20_4_ * 0.0;
            auVar60._24_4_ = auVar91._24_4_ * 0.0;
            auVar60._28_4_ = 0;
            auVar82 = vfmsub231ps_fma(auVar60,auVar119,auVar103);
            auVar154._0_4_ = fVar126 * auVar103._0_4_;
            auVar154._4_4_ = fVar129 * auVar103._4_4_;
            auVar154._8_4_ = fVar128 * auVar103._8_4_;
            auVar154._12_4_ = fVar132 * auVar103._12_4_;
            auVar154._16_4_ = auVar103._16_4_ * 0.0;
            auVar154._20_4_ = auVar103._20_4_ * 0.0;
            auVar154._24_4_ = auVar103._24_4_ * 0.0;
            auVar154._28_4_ = 0;
            auVar81 = vfmsub231ps_fma(auVar154,auVar102,auVar90);
            auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar88,ZEXT1632(auVar82));
            auVar160._0_4_ = auVar90._0_4_ * auVar119._0_4_;
            auVar160._4_4_ = auVar90._4_4_ * auVar119._4_4_;
            auVar160._8_4_ = auVar90._8_4_ * auVar119._8_4_;
            auVar160._12_4_ = auVar90._12_4_ * auVar119._12_4_;
            auVar160._16_4_ = auVar90._16_4_ * fVar150;
            auVar160._20_4_ = auVar90._20_4_ * fVar140;
            auVar160._24_4_ = auVar90._24_4_ * fVar133;
            auVar160._28_4_ = 0;
            auVar82 = vfmsub231ps_fma(auVar160,auVar96,auVar91);
            auVar97 = vfmadd231ps_avx512vl(auVar93,auVar88,ZEXT1632(auVar82));
            auVar93 = vmulps_avx512vl(auVar94,auVar120);
            auVar93 = vfmsub231ps_avx512vl(auVar93,auVar92,auVar122);
            auVar61._4_4_ = auVar95._4_4_ * auVar122._4_4_;
            auVar61._0_4_ = auVar95._0_4_ * auVar122._0_4_;
            auVar61._8_4_ = auVar95._8_4_ * auVar122._8_4_;
            auVar61._12_4_ = auVar95._12_4_ * auVar122._12_4_;
            auVar61._16_4_ = auVar95._16_4_ * fVar79;
            auVar61._20_4_ = auVar95._20_4_ * fVar149;
            auVar61._24_4_ = auVar95._24_4_ * fVar78;
            auVar61._28_4_ = iVar2;
            auVar82 = vfmsub231ps_fma(auVar61,auVar121,auVar94);
            auVar161._0_4_ = auVar121._0_4_ * auVar92._0_4_;
            auVar161._4_4_ = auVar121._4_4_ * auVar92._4_4_;
            auVar161._8_4_ = auVar121._8_4_ * auVar92._8_4_;
            auVar161._12_4_ = auVar121._12_4_ * auVar92._12_4_;
            auVar161._16_4_ = fVar141 * auVar92._16_4_;
            auVar161._20_4_ = fVar167 * auVar92._20_4_;
            auVar161._24_4_ = fVar169 * auVar92._24_4_;
            auVar161._28_4_ = 0;
            auVar81 = vfmsub231ps_fma(auVar161,auVar95,auVar120);
            auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar88,auVar93);
            auVar89 = vfmadd231ps_avx512vl(auVar93,auVar88,ZEXT1632(auVar82));
            auVar93 = vmaxps_avx(auVar97,auVar89);
            uVar142 = vcmpps_avx512vl(auVar93,auVar88,2);
            bVar77 = bVar77 & (byte)uVar142;
            auVar181 = ZEXT3264(auVar147);
            if (bVar77 != 0) {
              uVar134 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar180._4_4_ = uVar134;
              auVar180._0_4_ = uVar134;
              auVar180._8_4_ = uVar134;
              auVar180._12_4_ = uVar134;
              auVar180._16_4_ = uVar134;
              auVar180._20_4_ = uVar134;
              auVar180._24_4_ = uVar134;
              auVar180._28_4_ = uVar134;
              auVar182 = ZEXT3264(auVar180);
              auVar62._4_4_ = auVar94._4_4_ * auVar90._4_4_;
              auVar62._0_4_ = auVar94._0_4_ * auVar90._0_4_;
              auVar62._8_4_ = auVar94._8_4_ * auVar90._8_4_;
              auVar62._12_4_ = auVar94._12_4_ * auVar90._12_4_;
              auVar62._16_4_ = auVar94._16_4_ * auVar90._16_4_;
              auVar62._20_4_ = auVar94._20_4_ * auVar90._20_4_;
              auVar62._24_4_ = auVar94._24_4_ * auVar90._24_4_;
              auVar62._28_4_ = auVar93._28_4_;
              auVar80 = vfmsub231ps_fma(auVar62,auVar95,auVar91);
              auVar63._4_4_ = auVar91._4_4_ * auVar92._4_4_;
              auVar63._0_4_ = auVar91._0_4_ * auVar92._0_4_;
              auVar63._8_4_ = auVar91._8_4_ * auVar92._8_4_;
              auVar63._12_4_ = auVar91._12_4_ * auVar92._12_4_;
              auVar63._16_4_ = auVar91._16_4_ * auVar92._16_4_;
              auVar63._20_4_ = auVar91._20_4_ * auVar92._20_4_;
              auVar63._24_4_ = auVar91._24_4_ * auVar92._24_4_;
              auVar63._28_4_ = auVar91._28_4_;
              auVar81 = vfmsub231ps_fma(auVar63,auVar103,auVar94);
              auVar64._4_4_ = auVar95._4_4_ * auVar103._4_4_;
              auVar64._0_4_ = auVar95._0_4_ * auVar103._0_4_;
              auVar64._8_4_ = auVar95._8_4_ * auVar103._8_4_;
              auVar64._12_4_ = auVar95._12_4_ * auVar103._12_4_;
              auVar64._16_4_ = auVar95._16_4_ * auVar103._16_4_;
              auVar64._20_4_ = auVar95._20_4_ * auVar103._20_4_;
              auVar64._24_4_ = auVar95._24_4_ * auVar103._24_4_;
              auVar64._28_4_ = auVar95._28_4_;
              auVar6 = vfmsub231ps_fma(auVar64,auVar92,auVar90);
              auVar82 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar81),ZEXT1632(auVar6));
              auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),ZEXT1632(auVar80),auVar88);
              auVar90 = vrcp14ps_avx512vl(auVar93);
              auVar92 = auVar193._0_32_;
              auVar91 = vfnmadd213ps_avx512vl(auVar90,auVar93,auVar92);
              auVar82 = vfmadd132ps_fma(auVar91,auVar90,auVar90);
              auVar65._4_4_ = auVar6._4_4_ * auVar119._4_4_;
              auVar65._0_4_ = auVar6._0_4_ * auVar119._0_4_;
              auVar65._8_4_ = auVar6._8_4_ * auVar119._8_4_;
              auVar65._12_4_ = auVar6._12_4_ * auVar119._12_4_;
              auVar65._16_4_ = fVar150 * 0.0;
              auVar65._20_4_ = fVar140 * 0.0;
              auVar65._24_4_ = fVar133 * 0.0;
              auVar65._28_4_ = iVar1;
              auVar81 = vfmadd231ps_fma(auVar65,auVar96,ZEXT1632(auVar81));
              auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar102,ZEXT1632(auVar80));
              fVar150 = auVar82._0_4_;
              fVar133 = auVar82._4_4_;
              fVar140 = auVar82._8_4_;
              fVar141 = auVar82._12_4_;
              local_3a0 = ZEXT1632(CONCAT412(auVar81._12_4_ * fVar141,
                                             CONCAT48(auVar81._8_4_ * fVar140,
                                                      CONCAT44(auVar81._4_4_ * fVar133,
                                                               auVar81._0_4_ * fVar150))));
              uVar142 = vcmpps_avx512vl(local_3a0,auVar180,2);
              auVar68._4_4_ = uStack_41c;
              auVar68._0_4_ = local_420;
              auVar68._8_4_ = uStack_418;
              auVar68._12_4_ = uStack_414;
              auVar68._16_4_ = uStack_410;
              auVar68._20_4_ = uStack_40c;
              auVar68._24_4_ = uStack_408;
              auVar68._28_4_ = uStack_404;
              uVar23 = vcmpps_avx512vl(local_3a0,auVar68,0xd);
              bVar77 = (byte)uVar142 & (byte)uVar23 & bVar77;
              if (bVar77 != 0) {
                uVar142 = vcmpps_avx512vl(auVar93,auVar88,4);
                bVar77 = bVar77 & (byte)uVar142;
                auVar186 = ZEXT3264(local_680);
                if (bVar77 != 0) {
                  fVar167 = auVar97._0_4_ * fVar150;
                  fVar169 = auVar97._4_4_ * fVar133;
                  auVar66._4_4_ = fVar169;
                  auVar66._0_4_ = fVar167;
                  fVar78 = auVar97._8_4_ * fVar140;
                  auVar66._8_4_ = fVar78;
                  fVar79 = auVar97._12_4_ * fVar141;
                  auVar66._12_4_ = fVar79;
                  fVar149 = auVar97._16_4_ * 0.0;
                  auVar66._16_4_ = fVar149;
                  fVar125 = auVar97._20_4_ * 0.0;
                  auVar66._20_4_ = fVar125;
                  fVar126 = auVar97._24_4_ * 0.0;
                  auVar66._24_4_ = fVar126;
                  auVar66._28_4_ = auVar93._28_4_;
                  auVar90 = vsubps_avx512vl(auVar92,auVar66);
                  local_3e0._0_4_ =
                       (float)((uint)(bVar70 & 1) * (int)fVar167 |
                              (uint)!(bool)(bVar70 & 1) * auVar90._0_4_);
                  bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
                  local_3e0._4_4_ =
                       (float)((uint)bVar14 * (int)fVar169 | (uint)!bVar14 * auVar90._4_4_);
                  bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
                  local_3e0._8_4_ =
                       (float)((uint)bVar14 * (int)fVar78 | (uint)!bVar14 * auVar90._8_4_);
                  bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
                  local_3e0._12_4_ =
                       (float)((uint)bVar14 * (int)fVar79 | (uint)!bVar14 * auVar90._12_4_);
                  bVar14 = (bool)((byte)(uVar72 >> 4) & 1);
                  local_3e0._16_4_ =
                       (float)((uint)bVar14 * (int)fVar149 | (uint)!bVar14 * auVar90._16_4_);
                  bVar14 = (bool)((byte)(uVar72 >> 5) & 1);
                  local_3e0._20_4_ =
                       (float)((uint)bVar14 * (int)fVar125 | (uint)!bVar14 * auVar90._20_4_);
                  bVar14 = (bool)((byte)(uVar72 >> 6) & 1);
                  local_3e0._24_4_ =
                       (float)((uint)bVar14 * (int)fVar126 | (uint)!bVar14 * auVar90._24_4_);
                  bVar14 = SUB81(uVar72 >> 7,0);
                  local_3e0._28_4_ =
                       (float)((uint)bVar14 * auVar93._28_4_ | (uint)!bVar14 * auVar90._28_4_);
                  auVar93 = vsubps_avx(ZEXT1632(auVar84),auVar98);
                  auVar82 = vfmadd213ps_fma(auVar93,local_3e0,auVar98);
                  uVar134 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
                  auVar31._4_4_ = uVar134;
                  auVar31._0_4_ = uVar134;
                  auVar31._8_4_ = uVar134;
                  auVar31._12_4_ = uVar134;
                  auVar31._16_4_ = uVar134;
                  auVar31._20_4_ = uVar134;
                  auVar31._24_4_ = uVar134;
                  auVar31._28_4_ = uVar134;
                  auVar93 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar82._12_4_ + auVar82._12_4_,
                                                               CONCAT48(auVar82._8_4_ +
                                                                        auVar82._8_4_,
                                                                        CONCAT44(auVar82._4_4_ +
                                                                                 auVar82._4_4_,
                                                                                 auVar82._0_4_ +
                                                                                 auVar82._0_4_)))),
                                            auVar31);
                  uVar142 = vcmpps_avx512vl(local_3a0,auVar93,6);
                  if (((byte)uVar142 & bVar77) != 0) {
                    auVar146._0_4_ = auVar89._0_4_ * fVar150;
                    auVar146._4_4_ = auVar89._4_4_ * fVar133;
                    auVar146._8_4_ = auVar89._8_4_ * fVar140;
                    auVar146._12_4_ = auVar89._12_4_ * fVar141;
                    auVar146._16_4_ = auVar89._16_4_ * 0.0;
                    auVar146._20_4_ = auVar89._20_4_ * 0.0;
                    auVar146._24_4_ = auVar89._24_4_ * 0.0;
                    auVar146._28_4_ = 0;
                    auVar93 = vsubps_avx512vl(auVar92,auVar146);
                    auVar124._0_4_ =
                         (uint)(bVar70 & 1) * (int)auVar146._0_4_ |
                         (uint)!(bool)(bVar70 & 1) * auVar93._0_4_;
                    bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
                    auVar124._4_4_ =
                         (uint)bVar14 * (int)auVar146._4_4_ | (uint)!bVar14 * auVar93._4_4_;
                    bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
                    auVar124._8_4_ =
                         (uint)bVar14 * (int)auVar146._8_4_ | (uint)!bVar14 * auVar93._8_4_;
                    bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
                    auVar124._12_4_ =
                         (uint)bVar14 * (int)auVar146._12_4_ | (uint)!bVar14 * auVar93._12_4_;
                    bVar14 = (bool)((byte)(uVar72 >> 4) & 1);
                    auVar124._16_4_ =
                         (uint)bVar14 * (int)auVar146._16_4_ | (uint)!bVar14 * auVar93._16_4_;
                    bVar14 = (bool)((byte)(uVar72 >> 5) & 1);
                    auVar124._20_4_ =
                         (uint)bVar14 * (int)auVar146._20_4_ | (uint)!bVar14 * auVar93._20_4_;
                    bVar14 = (bool)((byte)(uVar72 >> 6) & 1);
                    auVar124._24_4_ =
                         (uint)bVar14 * (int)auVar146._24_4_ | (uint)!bVar14 * auVar93._24_4_;
                    auVar124._28_4_ = (uint)!SUB81(uVar72 >> 7,0) * auVar93._28_4_;
                    auVar32._8_4_ = 0x40000000;
                    auVar32._0_8_ = 0x4000000040000000;
                    auVar32._12_4_ = 0x40000000;
                    auVar32._16_4_ = 0x40000000;
                    auVar32._20_4_ = 0x40000000;
                    auVar32._24_4_ = 0x40000000;
                    auVar32._28_4_ = 0x40000000;
                    local_3c0 = vfmsub132ps_avx512vl(auVar124,auVar92,auVar32);
                    local_380 = (undefined4)lVar76;
                    local_360 = local_650._0_8_;
                    uStack_358 = local_650._8_8_;
                    local_350 = local_660._0_8_;
                    uStack_348 = local_660._8_8_;
                    pGVar12 = (context->scene->geometries).items[uVar73].ptr;
                    if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                      bVar70 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar70 = 1, pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar82 = vcvtsi2ss_avx512f(auVar187._0_16_,local_380);
                      fVar150 = auVar82._0_4_;
                      local_320[0] = (fVar150 + local_3e0._0_4_ + 0.0) * (float)local_480;
                      local_320[1] = (fVar150 + local_3e0._4_4_ + 1.0) * local_480._4_4_;
                      local_320[2] = (fVar150 + local_3e0._8_4_ + 2.0) * fStack_478;
                      local_320[3] = (fVar150 + local_3e0._12_4_ + 3.0) * fStack_474;
                      fStack_310 = (fVar150 + local_3e0._16_4_ + 4.0) * fStack_470;
                      fStack_30c = (fVar150 + local_3e0._20_4_ + 5.0) * fStack_46c;
                      fStack_308 = (fVar150 + local_3e0._24_4_ + 6.0) * fStack_468;
                      fStack_304 = fVar150 + local_3e0._28_4_ + 7.0;
                      local_300 = local_3c0;
                      local_2e0 = local_3a0;
                      uVar72 = CONCAT71(0,(byte)uVar142 & bVar77);
                      local_4e0._0_8_ = uVar72;
                      lVar25 = 0;
                      for (; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x8000000000000000) {
                        lVar25 = lVar25 + 1;
                      }
                      local_4c0._0_8_ = lVar25;
                      local_520._0_4_ = (int)uVar71;
                      local_2c0 = auVar180;
                      local_37c = iVar11;
                      local_370 = auVar22;
                      do {
                        auVar80 = auVar191._0_16_;
                        fVar150 = local_320[local_4c0._0_8_];
                        auVar144._4_4_ = fVar150;
                        auVar144._0_4_ = fVar150;
                        auVar144._8_4_ = fVar150;
                        auVar144._12_4_ = fVar150;
                        local_220._16_4_ = fVar150;
                        local_220._0_16_ = auVar144;
                        local_220._20_4_ = fVar150;
                        local_220._24_4_ = fVar150;
                        local_220._28_4_ = fVar150;
                        local_200 = *(undefined4 *)(local_300 + local_4c0._0_8_ * 4);
                        *(undefined4 *)(ray + k * 4 + 0x100) =
                             *(undefined4 *)(local_2e0 + local_4c0._0_8_ * 4);
                        local_6b0.context = context->user;
                        fVar133 = 1.0 - fVar150;
                        auVar27._8_4_ = 0x80000000;
                        auVar27._0_8_ = 0x8000000080000000;
                        auVar27._12_4_ = 0x80000000;
                        auVar81 = vxorps_avx512vl(ZEXT416((uint)fVar133),auVar27);
                        auVar82 = ZEXT416((uint)(fVar150 * fVar133 * 4.0));
                        auVar84 = vfnmsub213ss_fma(auVar144,auVar144,auVar82);
                        auVar82 = vfmadd213ss_fma(ZEXT416((uint)fVar133),ZEXT416((uint)fVar133),
                                                  auVar82);
                        fVar133 = fVar133 * auVar81._0_4_ * 0.5;
                        fVar140 = auVar84._0_4_ * 0.5;
                        fVar141 = auVar82._0_4_ * 0.5;
                        fVar150 = fVar150 * fVar150 * 0.5;
                        auVar164._0_4_ = fVar150 * (float)local_490._0_4_;
                        auVar164._4_4_ = fVar150 * (float)local_490._4_4_;
                        auVar164._8_4_ = fVar150 * fStack_488;
                        auVar164._12_4_ = fVar150 * fStack_484;
                        auVar137._4_4_ = fVar141;
                        auVar137._0_4_ = fVar141;
                        auVar137._8_4_ = fVar141;
                        auVar137._12_4_ = fVar141;
                        auVar82 = vfmadd132ps_fma(auVar137,auVar164,local_660);
                        auVar156._4_4_ = fVar140;
                        auVar156._0_4_ = fVar140;
                        auVar156._8_4_ = fVar140;
                        auVar156._12_4_ = fVar140;
                        auVar82 = vfmadd132ps_fma(auVar156,auVar82,local_650);
                        auVar138._4_4_ = fVar133;
                        auVar138._0_4_ = fVar133;
                        auVar138._8_4_ = fVar133;
                        auVar138._12_4_ = fVar133;
                        auVar82 = vfmadd213ps_fma(auVar138,auVar22,auVar82);
                        local_280 = auVar82._0_4_;
                        auVar162._8_4_ = 1;
                        auVar162._0_8_ = 0x100000001;
                        auVar162._12_4_ = 1;
                        auVar162._16_4_ = 1;
                        auVar162._20_4_ = 1;
                        auVar162._24_4_ = 1;
                        auVar162._28_4_ = 1;
                        local_260 = vpermps_avx2(auVar162,ZEXT1632(auVar82));
                        auVar166._8_4_ = 2;
                        auVar166._0_8_ = 0x200000002;
                        auVar166._12_4_ = 2;
                        auVar166._16_4_ = 2;
                        auVar166._20_4_ = 2;
                        auVar166._24_4_ = 2;
                        auVar166._28_4_ = 2;
                        local_240 = vpermps_avx2(auVar166,ZEXT1632(auVar82));
                        uStack_27c = local_280;
                        uStack_278 = local_280;
                        uStack_274 = local_280;
                        uStack_270 = local_280;
                        uStack_26c = local_280;
                        uStack_268 = local_280;
                        uStack_264 = local_280;
                        uStack_1fc = local_200;
                        uStack_1f8 = local_200;
                        uStack_1f4 = local_200;
                        uStack_1f0 = local_200;
                        uStack_1ec = local_200;
                        uStack_1e8 = local_200;
                        uStack_1e4 = local_200;
                        local_1e0 = local_440._0_8_;
                        uStack_1d8 = local_440._8_8_;
                        uStack_1d0 = local_440._16_8_;
                        uStack_1c8 = local_440._24_8_;
                        local_1c0 = local_460;
                        vpcmpeqd_avx2(local_460,local_460);
                        local_1a0 = (local_6b0.context)->instID[0];
                        uStack_19c = local_1a0;
                        uStack_198 = local_1a0;
                        uStack_194 = local_1a0;
                        uStack_190 = local_1a0;
                        uStack_18c = local_1a0;
                        uStack_188 = local_1a0;
                        uStack_184 = local_1a0;
                        local_180 = (local_6b0.context)->instPrimID[0];
                        uStack_17c = local_180;
                        uStack_178 = local_180;
                        uStack_174 = local_180;
                        uStack_170 = local_180;
                        uStack_16c = local_180;
                        uStack_168 = local_180;
                        uStack_164 = local_180;
                        local_5c0 = local_2a0;
                        local_6b0.valid = (int *)local_5c0;
                        local_6b0.geometryUserPtr = pGVar12->userPtr;
                        local_6b0.hit = (RTCHitN *)&local_280;
                        local_6b0.N = 8;
                        local_6b0.ray = (RTCRayN *)ray;
                        if (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar12->occlusionFilterN)(&local_6b0);
                          auVar182 = ZEXT3264(local_2c0);
                          uVar71 = (ulong)(uint)local_520._0_4_;
                          auVar186 = ZEXT3264(local_680);
                          auVar181 = ZEXT3264(local_580);
                          auVar190 = ZEXT3264(local_560);
                          auVar189 = ZEXT3264(local_540);
                          auVar188 = ZEXT3264(local_500);
                          auVar82 = vxorps_avx512vl(auVar80,auVar80);
                          auVar191 = ZEXT1664(auVar82);
                          auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar193 = ZEXT3264(auVar93);
                        }
                        auVar82 = auVar191._0_16_;
                        if (local_5c0 == (undefined1  [32])0x0) {
                          auVar192 = ZEXT3264(local_640);
                          auVar194 = ZEXT3264(local_600);
                          auVar195 = ZEXT3264(local_620);
                        }
                        else {
                          p_Var13 = context->args->filter;
                          if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var13)(&local_6b0);
                            auVar182 = ZEXT3264(local_2c0);
                            uVar71 = (ulong)(uint)local_520._0_4_;
                            auVar186 = ZEXT3264(local_680);
                            auVar181 = ZEXT3264(local_580);
                            auVar190 = ZEXT3264(local_560);
                            auVar189 = ZEXT3264(local_540);
                            auVar188 = ZEXT3264(local_500);
                            auVar82 = vxorps_avx512vl(auVar82,auVar82);
                            auVar191 = ZEXT1664(auVar82);
                            auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar193 = ZEXT3264(auVar93);
                          }
                          uVar72 = vptestmd_avx512vl(local_5c0,local_5c0);
                          auVar93 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar14 = (bool)((byte)uVar72 & 1);
                          bVar15 = (bool)((byte)(uVar72 >> 1) & 1);
                          bVar16 = (bool)((byte)(uVar72 >> 2) & 1);
                          bVar17 = (bool)((byte)(uVar72 >> 3) & 1);
                          bVar18 = (bool)((byte)(uVar72 >> 4) & 1);
                          bVar19 = (bool)((byte)(uVar72 >> 5) & 1);
                          bVar20 = (bool)((byte)(uVar72 >> 6) & 1);
                          bVar21 = SUB81(uVar72 >> 7,0);
                          *(uint *)(local_6b0.ray + 0x100) =
                               (uint)bVar14 * auVar93._0_4_ |
                               (uint)!bVar14 * *(int *)(local_6b0.ray + 0x100);
                          *(uint *)(local_6b0.ray + 0x104) =
                               (uint)bVar15 * auVar93._4_4_ |
                               (uint)!bVar15 * *(int *)(local_6b0.ray + 0x104);
                          *(uint *)(local_6b0.ray + 0x108) =
                               (uint)bVar16 * auVar93._8_4_ |
                               (uint)!bVar16 * *(int *)(local_6b0.ray + 0x108);
                          *(uint *)(local_6b0.ray + 0x10c) =
                               (uint)bVar17 * auVar93._12_4_ |
                               (uint)!bVar17 * *(int *)(local_6b0.ray + 0x10c);
                          *(uint *)(local_6b0.ray + 0x110) =
                               (uint)bVar18 * auVar93._16_4_ |
                               (uint)!bVar18 * *(int *)(local_6b0.ray + 0x110);
                          *(uint *)(local_6b0.ray + 0x114) =
                               (uint)bVar19 * auVar93._20_4_ |
                               (uint)!bVar19 * *(int *)(local_6b0.ray + 0x114);
                          *(uint *)(local_6b0.ray + 0x118) =
                               (uint)bVar20 * auVar93._24_4_ |
                               (uint)!bVar20 * *(int *)(local_6b0.ray + 0x118);
                          *(uint *)(local_6b0.ray + 0x11c) =
                               (uint)bVar21 * auVar93._28_4_ |
                               (uint)!bVar21 * *(int *)(local_6b0.ray + 0x11c);
                          auVar192 = ZEXT3264(local_640);
                          auVar194 = ZEXT3264(local_600);
                          auVar195 = ZEXT3264(local_620);
                          if (local_5c0 != (undefined1  [32])0x0) {
                            bVar70 = 1;
                            break;
                          }
                        }
                        *(int *)(ray + k * 4 + 0x100) = auVar182._0_4_;
                        local_4e0._0_8_ = local_4e0._0_8_ ^ 1L << (local_4c0._0_8_ & 0x3f);
                        bVar70 = 0;
                        lVar25 = 0;
                        for (uVar72 = local_4e0._0_8_; (uVar72 & 1) == 0;
                            uVar72 = uVar72 >> 1 | 0x8000000000000000) {
                          lVar25 = lVar25 + 1;
                        }
                        local_4c0._0_8_ = lVar25;
                      } while (local_4e0._0_8_ != 0);
                    }
                    uVar71 = CONCAT71((int7)(uVar71 >> 8),(byte)uVar71 | bVar70);
                  }
                }
                goto LAB_01cc03d9;
              }
            }
            auVar186 = ZEXT3264(local_680);
          }
LAB_01cc03d9:
          lVar76 = lVar76 + 8;
          auVar187 = auVar181;
        } while ((int)lVar76 < iVar11);
      }
      bVar77 = (byte)uVar71;
      if ((uVar71 & 1) != 0) break;
      uVar134 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar30._4_4_ = uVar134;
      auVar30._0_4_ = uVar134;
      auVar30._8_4_ = uVar134;
      auVar30._12_4_ = uVar134;
      auVar30._16_4_ = uVar134;
      auVar30._20_4_ = uVar134;
      auVar30._24_4_ = uVar134;
      auVar30._28_4_ = uVar134;
      uVar142 = vcmpps_avx512vl(local_80,auVar30,2);
      uVar73 = (uint)uVar74 & (uint)uVar142;
      uVar74 = (ulong)uVar73;
    } while (uVar73 != 0);
  }
  return (bool)(bVar77 & 1);
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }